

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O3

string * __thiscall
KMeans::genModelEvaluationFunction_abi_cxx11_(string *__return_storage_ptr__,KMeans *this)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  string *psVar5;
  char cVar6;
  bool bVar7;
  long *plVar8;
  Attribute *pAVar9;
  undefined8 *puVar10;
  mapped_type *pmVar11;
  long *plVar12;
  ulong *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_type *psVar15;
  ulong uVar16;
  size_t attID;
  char cVar17;
  _Alloc_hider _Var18;
  undefined8 uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  string __str_1;
  string numCategVar;
  string precompMeanSum;
  string evalFunction;
  string distance;
  string testTuple;
  string loadFunction;
  string valueToMeanMap;
  string attrConstruct;
  string attributeString;
  string local_e38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e18;
  long local_e10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e08;
  string local_df8;
  long *local_dd8;
  long local_dd0;
  long local_dc8;
  long lStack_dc0;
  ulong *local_db8;
  long local_db0;
  ulong local_da8;
  long lStack_da0;
  ulong *local_d98;
  long local_d90;
  ulong local_d88;
  long lStack_d80;
  ulong *local_d78;
  long local_d70;
  ulong local_d68;
  undefined8 uStack_d60;
  ulong *local_d58;
  long local_d50;
  ulong local_d48;
  long lStack_d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8;
  ulong *local_cb8;
  long local_cb0;
  ulong local_ca8;
  undefined8 uStack_ca0;
  ulong *local_c98;
  long local_c90;
  ulong local_c88;
  long lStack_c80;
  ulong *local_c78;
  long local_c70;
  ulong local_c68;
  long lStack_c60;
  ulong *local_c58;
  long local_c50;
  ulong local_c48;
  long lStack_c40;
  ulong *local_c38;
  long local_c30;
  ulong local_c28;
  long lStack_c20;
  ulong *local_c18;
  long local_c10;
  ulong local_c08;
  long lStack_c00;
  ulong *local_bf8;
  long local_bf0;
  ulong local_be8;
  long lStack_be0;
  ulong *local_bd8;
  long local_bd0;
  ulong local_bc8;
  long lStack_bc0;
  ulong *local_bb8;
  long local_bb0;
  ulong local_ba8;
  undefined8 uStack_ba0;
  ulong *local_b98;
  long local_b90;
  ulong local_b88;
  long lStack_b80;
  ulong *local_b78;
  long local_b70;
  ulong local_b68;
  long lStack_b60;
  ulong *local_b58;
  long local_b50;
  ulong local_b48;
  long lStack_b40;
  ulong *local_b38;
  long local_b30;
  ulong local_b28;
  undefined8 uStack_b20;
  string local_b18;
  ulong *local_af8;
  long local_af0;
  ulong local_ae8;
  long lStack_ae0;
  undefined8 *local_ad8;
  undefined8 local_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  ulong *local_ab8;
  long local_ab0;
  ulong local_aa8;
  undefined8 uStack_aa0;
  ulong *local_a98;
  long local_a90;
  ulong local_a88;
  undefined8 uStack_a80;
  ulong *local_a78;
  long local_a70;
  ulong local_a68;
  undefined8 uStack_a60;
  ulong *local_a58;
  long local_a50;
  ulong local_a48;
  undefined8 uStack_a40;
  ulong *local_a38;
  long local_a30;
  ulong local_a28;
  long lStack_a20;
  ulong *local_a18;
  long local_a10;
  ulong local_a08;
  long lStack_a00;
  ulong *local_9f8;
  long local_9f0;
  ulong local_9e8;
  long lStack_9e0;
  ulong *local_9d8;
  long local_9d0;
  ulong local_9c8;
  long lStack_9c0;
  ulong *local_9b8;
  long local_9b0;
  ulong local_9a8;
  undefined8 uStack_9a0;
  long *local_998;
  long local_990;
  long local_988;
  long lStack_980;
  ulong *local_978;
  long local_970;
  ulong local_968;
  long lStack_960;
  ulong *local_958;
  long local_950;
  ulong local_948;
  long lStack_940;
  ulong *local_938;
  long local_930;
  ulong local_928;
  long lStack_920;
  ulong *local_918;
  long local_910;
  ulong local_908;
  long lStack_900;
  ulong *local_8f8;
  long local_8f0;
  ulong local_8e8;
  long lStack_8e0;
  long *local_8d8;
  long local_8d0;
  long local_8c8;
  long lStack_8c0;
  ulong *local_8b8;
  long local_8b0;
  ulong local_8a8;
  long lStack_8a0;
  ulong *local_898;
  long local_890;
  ulong local_888;
  long lStack_880;
  ulong *local_878;
  long local_870;
  ulong local_868;
  long lStack_860;
  ulong *local_858;
  long local_850;
  ulong local_848;
  long lStack_840;
  ulong *local_838;
  long local_830;
  ulong local_828;
  long lStack_820;
  ulong *local_818;
  long local_810;
  ulong local_808;
  long lStack_800;
  ulong *local_7f8;
  long local_7f0;
  ulong local_7e8;
  long lStack_7e0;
  ulong *local_7d8;
  long local_7d0;
  ulong local_7c8;
  long lStack_7c0;
  ulong *local_7b8;
  long local_7b0;
  ulong local_7a8;
  long lStack_7a0;
  ulong *local_798;
  long local_790;
  ulong local_788;
  long lStack_780;
  ulong *local_778;
  long local_770;
  ulong local_768;
  long lStack_760;
  ulong *local_758;
  long local_750;
  ulong local_748;
  long lStack_740;
  ulong *local_738;
  long local_730;
  ulong local_728;
  long lStack_720;
  ulong *local_718;
  long local_710;
  ulong local_708;
  long lStack_700;
  ulong *local_6f8;
  long local_6f0;
  ulong local_6e8;
  long lStack_6e0;
  ulong *local_6d8;
  long local_6d0;
  ulong local_6c8;
  long lStack_6c0;
  ulong *local_6b8;
  long local_6b0;
  ulong local_6a8 [2];
  ulong *local_698;
  long local_690;
  ulong local_688 [2];
  ulong *local_678;
  long local_670;
  ulong local_668 [2];
  ulong *local_658;
  long local_650;
  ulong local_648 [2];
  ulong *local_638;
  long local_630;
  ulong local_628 [2];
  ulong *local_618;
  long local_610;
  ulong local_608 [2];
  ulong *local_5f8;
  long local_5f0;
  ulong local_5e8 [2];
  ulong *local_5d8;
  long local_5d0;
  ulong local_5c8 [2];
  ulong *local_5b8;
  long local_5b0;
  ulong local_5a8 [2];
  ulong *local_598;
  long local_590;
  ulong local_588 [2];
  ulong *local_578;
  long local_570;
  ulong local_568 [2];
  ulong *local_558;
  long local_550;
  ulong local_548 [2];
  ulong *local_538;
  long local_530;
  ulong local_528 [2];
  ulong *local_518;
  long local_510;
  ulong local_508 [2];
  ulong *local_4f8;
  long local_4f0;
  ulong local_4e8 [2];
  ulong *local_4d8;
  long local_4d0;
  ulong local_4c8 [2];
  ulong *local_4b8;
  long local_4b0;
  ulong local_4a8 [2];
  ulong *local_498;
  long local_490;
  ulong local_488 [2];
  ulong *local_478;
  long local_470;
  ulong local_468 [2];
  ulong *local_458;
  long local_450;
  ulong local_448 [2];
  ulong *local_438;
  long local_430;
  ulong local_428 [2];
  ulong *local_418;
  long local_410;
  ulong local_408 [2];
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8 [2];
  ulong *local_3d8;
  long local_3d0;
  ulong local_3c8 [2];
  ulong *local_3b8;
  long local_3b0;
  ulong local_3a8 [2];
  undefined8 *local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 *local_2b8;
  undefined8 local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  string *local_198;
  ulong *local_190;
  long local_188;
  ulong local_180 [2];
  ulong *local_170;
  long local_168;
  ulong local_160 [2];
  ulong *local_150;
  long local_148;
  ulong local_140 [2];
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
  local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_cf8,'\f');
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_cf8);
  local_8d8 = &local_8c8;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_8c8 = *plVar12;
    lStack_8c0 = plVar8[3];
  }
  else {
    local_8c8 = *plVar12;
    local_8d8 = (long *)*plVar8;
  }
  local_8d0 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_198 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p);
  }
  if (this->numberOfOriginalVariables != 0) {
    paVar3 = &local_cd8.field_2;
    attID = 0;
    do {
      pAVar9 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          attID);
      local_dd8 = &local_dc8;
      std::__cxx11::string::_M_construct((ulong)&local_dd8,'\x0f');
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_dd8,0,(char *)0x0,0x2afdd1);
      local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
      puVar13 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_df8.field_2._M_allocated_capacity = *puVar13;
        local_df8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_df8.field_2._M_allocated_capacity = *puVar13;
        local_df8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_df8._M_string_length = plVar8[1];
      *plVar8 = (long)puVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_df8);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 == paVar14) {
        local_e08._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_e08._8_8_ = plVar8[3];
        local_e18 = &local_e08;
      }
      else {
        local_e08._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_e18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8;
      }
      local_e10 = plVar8[1];
      *plVar8 = (long)paVar14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      Application::typeToStr_abi_cxx11_(&local_e38,&this->super_Application,pAVar9->_type);
      uVar19 = 0xf;
      if (local_e18 != &local_e08) {
        uVar19 = local_e08._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_e38._M_string_length + local_e10) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          uVar19 = local_e38.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_e38._M_string_length + local_e10) goto LAB_001d5da7;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_e38,0,(char *)0x0,(ulong)local_e18);
      }
      else {
LAB_001d5da7:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_e18,(ulong)local_e38._M_dataplus._M_p);
      }
      local_c98 = &local_c88;
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_c88 = *puVar13;
        lStack_c80 = puVar10[3];
      }
      else {
        local_c88 = *puVar13;
        local_c98 = (ulong *)*puVar10;
      }
      local_c90 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)puVar13 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_c98);
      puVar13 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar13) {
        local_d48 = *puVar13;
        lStack_d40 = plVar8[3];
        local_d58 = &local_d48;
      }
      else {
        local_d48 = *puVar13;
        local_d58 = (ulong *)*plVar8;
      }
      local_d50 = plVar8[1];
      *plVar8 = (long)puVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d58,(ulong)(pAVar9->_name)._M_dataplus._M_p);
      psVar15 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_cd8.field_2._M_allocated_capacity = *psVar15;
        local_cd8.field_2._8_8_ = plVar8[3];
        local_cd8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_cd8.field_2._M_allocated_capacity = *psVar15;
        local_cd8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_cd8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_cd8);
      local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
      psVar15 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_cf8.field_2._M_allocated_capacity = *psVar15;
        local_cf8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_cf8.field_2._M_allocated_capacity = *psVar15;
        local_cf8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_cf8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_cf8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
        operator_delete(local_cf8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != paVar3) {
        operator_delete(local_cd8._M_dataplus._M_p);
      }
      if (local_d58 != &local_d48) {
        operator_delete(local_d58);
      }
      if (local_c98 != &local_c88) {
        operator_delete(local_c98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p);
      }
      if (local_e18 != &local_e08) {
        operator_delete(local_e18);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
        operator_delete(local_df8._M_dataplus._M_p);
      }
      if (local_dd8 != &local_dc8) {
        operator_delete(local_dd8);
      }
      local_e18 = &local_e08;
      std::__cxx11::string::_M_construct((ulong)&local_e18,'\x06');
      Application::typeToStr_abi_cxx11_(&local_df8,&this->super_Application,pAVar9->_type);
      uVar19 = 0xf;
      if (local_e18 != &local_e08) {
        uVar19 = local_e08._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_df8._M_string_length + local_e10) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          uVar19 = local_df8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_df8._M_string_length + local_e10) goto LAB_001d607b;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_df8,0,(char *)0x0,(ulong)local_e18);
      }
      else {
LAB_001d607b:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_e18,(ulong)local_df8._M_dataplus._M_p);
      }
      local_c98 = &local_c88;
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_c88 = *puVar13;
        lStack_c80 = puVar10[3];
      }
      else {
        local_c88 = *puVar13;
        local_c98 = (ulong *)*puVar10;
      }
      local_c90 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)puVar13 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_c98);
      puVar13 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar13) {
        local_d48 = *puVar13;
        lStack_d40 = plVar8[3];
        local_d58 = &local_d48;
      }
      else {
        local_d48 = *puVar13;
        local_d58 = (ulong *)*plVar8;
      }
      local_d50 = plVar8[1];
      *plVar8 = (long)puVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_d58,(ulong)(pAVar9->_name)._M_dataplus._M_p);
      psVar15 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_cd8.field_2._M_allocated_capacity = *psVar15;
        local_cd8.field_2._8_8_ = plVar8[3];
        local_cd8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_cd8.field_2._M_allocated_capacity = *psVar15;
        local_cd8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_cd8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_cd8);
      psVar15 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_cf8.field_2._M_allocated_capacity = *psVar15;
        local_cf8.field_2._8_8_ = plVar8[3];
        local_cf8._M_dataplus._M_p = (pointer)&local_cf8.field_2;
      }
      else {
        local_cf8.field_2._M_allocated_capacity = *psVar15;
        local_cf8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_cf8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar15;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_cf8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
        operator_delete(local_cf8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_cd8._M_dataplus._M_p != paVar3) {
        operator_delete(local_cd8._M_dataplus._M_p);
      }
      if (local_d58 != &local_d48) {
        operator_delete(local_d58);
      }
      if (local_c98 != &local_c88) {
        operator_delete(local_c98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
        operator_delete(local_df8._M_dataplus._M_p);
      }
      if (local_e18 != &local_e08) {
        operator_delete(local_e18);
      }
      attID = attID + 1;
    } while (attID < this->numberOfOriginalVariables);
  }
  paVar14 = &local_cf8.field_2;
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  local_d58 = &local_d48;
  std::__cxx11::string::_M_construct((ulong)&local_d58,'\x0f');
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_d58,0,(char *)0x0,0x2a3240);
  paVar3 = &local_cd8.field_2;
  psVar15 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_cd8.field_2._M_allocated_capacity = *psVar15;
    local_cd8.field_2._8_8_ = plVar8[3];
    local_cd8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_cd8.field_2._M_allocated_capacity = *psVar15;
    local_cd8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_cd8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_cd8);
  psVar15 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_cf8.field_2._M_allocated_capacity = *psVar15;
    local_cf8.field_2._8_8_ = plVar8[3];
    local_cf8._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_cf8.field_2._M_allocated_capacity = *psVar15;
    local_cf8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_cf8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_8d8,(ulong)local_cf8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != paVar14) {
    operator_delete(local_cf8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != paVar3) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  local_c78 = &local_c68;
  std::__cxx11::string::_M_construct((ulong)&local_c78,'\x03');
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c78);
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_d18.field_2._M_allocated_capacity = *puVar13;
    local_d18.field_2._8_8_ = plVar8[3];
  }
  else {
    local_d18.field_2._M_allocated_capacity = *puVar13;
    local_d18._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d18._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_c18 = &local_c08;
  std::__cxx11::string::_M_construct((ulong)&local_c18,'\x03');
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    uVar19 = local_d18.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_c10 + local_d18._M_string_length) {
    uVar22 = 0xf;
    if (local_c18 != &local_c08) {
      uVar22 = local_c08;
    }
    if (uVar22 < local_c10 + local_d18._M_string_length) goto LAB_001d6522;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_c18,0,(char *)0x0,(ulong)local_d18._M_dataplus._M_p);
  }
  else {
LAB_001d6522:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d18,(ulong)local_c18);
  }
  local_d78 = &local_d68;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_d68 = *puVar13;
    uStack_d60 = puVar10[3];
  }
  else {
    local_d68 = *puVar13;
    local_d78 = (ulong *)*puVar10;
  }
  local_d70 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d78);
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  psVar15 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_d38.field_2._M_allocated_capacity = *psVar15;
    local_d38.field_2._8_8_ = plVar8[3];
  }
  else {
    local_d38.field_2._M_allocated_capacity = *psVar15;
    local_d38._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d38._M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_d38,(ulong)local_1b8[0]);
  local_db8 = &local_da8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_da8 = *puVar13;
    lStack_da0 = plVar8[3];
  }
  else {
    local_da8 = *puVar13;
    local_db8 = (ulong *)*plVar8;
  }
  local_db0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_cb8 = &local_ca8;
  std::__cxx11::string::_M_construct((ulong)&local_cb8,'\x06');
  uVar22 = 0xf;
  if (local_db8 != &local_da8) {
    uVar22 = local_da8;
  }
  if (uVar22 < (ulong)(local_cb0 + local_db0)) {
    uVar22 = 0xf;
    if (local_cb8 != &local_ca8) {
      uVar22 = local_ca8;
    }
    if (uVar22 < (ulong)(local_cb0 + local_db0)) goto LAB_001d66e2;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_cb8,0,(char *)0x0,(ulong)local_db8);
  }
  else {
LAB_001d66e2:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_db8,(ulong)local_cb8);
  }
  local_d98 = &local_d88;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_d88 = *puVar13;
    lStack_d80 = puVar10[3];
  }
  else {
    local_d88 = *puVar13;
    local_d98 = (ulong *)*puVar10;
  }
  local_d90 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d98);
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_e38.field_2._M_allocated_capacity = *puVar13;
    local_e38.field_2._8_8_ = plVar8[3];
  }
  else {
    local_e38.field_2._M_allocated_capacity = *puVar13;
    local_e38._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_e38._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_c58 = &local_c48;
  std::__cxx11::string::_M_construct((ulong)&local_c58,'\x06');
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    uVar19 = local_e38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_c50 + local_e38._M_string_length) {
    uVar22 = 0xf;
    if (local_c58 != &local_c48) {
      uVar22 = local_c48;
    }
    if (uVar22 < local_c50 + local_e38._M_string_length) goto LAB_001d6820;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_c58,0,(char *)0x0,(ulong)local_e38._M_dataplus._M_p);
  }
  else {
LAB_001d6820:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e38,(ulong)local_c58);
  }
  local_dd8 = &local_dc8;
  plVar8 = puVar10 + 2;
  if ((long *)*puVar10 == plVar8) {
    local_dc8 = *plVar8;
    lStack_dc0 = puVar10[3];
  }
  else {
    local_dc8 = *plVar8;
    local_dd8 = (long *)*puVar10;
  }
  local_dd0 = puVar10[1];
  *puVar10 = plVar8;
  puVar10[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_dd8);
  paVar2 = &local_df8.field_2;
  psVar15 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_df8.field_2._M_allocated_capacity = *psVar15;
    local_df8.field_2._8_8_ = plVar8[3];
    local_df8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_df8.field_2._M_allocated_capacity = *psVar15;
    local_df8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_df8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_df8,(ulong)local_8d8);
  puVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_e08._M_allocated_capacity = *puVar13;
    local_e08._8_8_ = puVar10[3];
    local_e18 = &local_e08;
  }
  else {
    local_e08._M_allocated_capacity = *puVar13;
    local_e18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10;
  }
  local_e10 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_c38 = &local_c28;
  std::__cxx11::string::_M_construct((ulong)&local_c38,'\x06');
  uVar19 = 0xf;
  if (local_e18 != &local_e08) {
    uVar19 = local_e08._M_allocated_capacity;
  }
  if ((ulong)uVar19 < (ulong)(local_c30 + local_e10)) {
    uVar22 = 0xf;
    if (local_c38 != &local_c28) {
      uVar22 = local_c28;
    }
    if (uVar22 < (ulong)(local_c30 + local_e10)) goto LAB_001d69b7;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_c38,0,(char *)0x0,(ulong)local_e18);
  }
  else {
LAB_001d69b7:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e18,(ulong)local_c38);
  }
  local_c98 = &local_c88;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_c88 = *puVar13;
    lStack_c80 = puVar10[3];
  }
  else {
    local_c88 = *puVar13;
    local_c98 = (ulong *)*puVar10;
  }
  local_c90 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_c98);
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_d48 = *puVar13;
    lStack_d40 = puVar10[3];
    local_d58 = &local_d48;
  }
  else {
    local_d48 = *puVar13;
    local_d58 = (ulong *)*puVar10;
  }
  local_d50 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_bf8 = &local_be8;
  std::__cxx11::string::_M_construct((ulong)&local_bf8,'\x03');
  uVar22 = 0xf;
  if (local_d58 != &local_d48) {
    uVar22 = local_d48;
  }
  if (uVar22 < (ulong)(local_bf0 + local_d50)) {
    uVar22 = 0xf;
    if (local_bf8 != &local_be8) {
      uVar22 = local_be8;
    }
    if (uVar22 < (ulong)(local_bf0 + local_d50)) goto LAB_001d6b05;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_bf8,0,(char *)0x0,(ulong)local_d58);
  }
  else {
LAB_001d6b05:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d58,(ulong)local_bf8);
  }
  psVar15 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_cd8.field_2._M_allocated_capacity = *psVar15;
    local_cd8.field_2._8_8_ = puVar10[3];
    local_cd8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_cd8.field_2._M_allocated_capacity = *psVar15;
    local_cd8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_cd8._M_string_length = puVar10[1];
  *puVar10 = psVar15;
  puVar10[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_cd8);
  psVar15 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_cf8.field_2._M_allocated_capacity = *psVar15;
    local_cf8.field_2._8_8_ = plVar8[3];
    local_cf8._M_dataplus._M_p = (pointer)paVar14;
  }
  else {
    local_cf8.field_2._M_allocated_capacity = *psVar15;
    local_cf8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_cf8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != paVar3) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  if (local_bf8 != &local_be8) {
    operator_delete(local_bf8);
  }
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  if (local_c98 != &local_c88) {
    operator_delete(local_c98);
  }
  if (local_c38 != &local_c28) {
    operator_delete(local_c38);
  }
  if (local_e18 != &local_e08) {
    operator_delete(local_e18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != paVar2) {
    operator_delete(local_df8._M_dataplus._M_p);
  }
  if (local_dd8 != &local_dc8) {
    operator_delete(local_dd8);
  }
  if (local_c58 != &local_c48) {
    operator_delete(local_c58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  if (local_d98 != &local_d88) {
    operator_delete(local_d98);
  }
  if (local_cb8 != &local_ca8) {
    operator_delete(local_cb8);
  }
  if (local_db8 != &local_da8) {
    operator_delete(local_db8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p);
  }
  if (local_d78 != &local_d68) {
    operator_delete(local_d78);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p);
  }
  if (local_c78 != &local_c68) {
    operator_delete(local_c78);
  }
  local_8f8 = &local_8e8;
  std::__cxx11::string::_M_construct((ulong)&local_8f8,'\x03');
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_8f8);
  local_998 = &local_988;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_988 = *plVar12;
    lStack_980 = plVar8[3];
  }
  else {
    local_988 = *plVar12;
    local_998 = (long *)*plVar8;
  }
  local_990 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_998);
  local_b58 = &local_b48;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_b48 = *puVar13;
    lStack_b40 = plVar8[3];
  }
  else {
    local_b48 = *puVar13;
    local_b58 = (ulong *)*plVar8;
  }
  local_b50 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_9b8 = &local_9a8;
  std::__cxx11::string::_M_construct((ulong)&local_9b8,'\x03');
  uVar22 = 0xf;
  if (local_b58 != &local_b48) {
    uVar22 = local_b48;
  }
  if (uVar22 < (ulong)(local_9b0 + local_b50)) {
    uVar22 = 0xf;
    if (local_9b8 != &local_9a8) {
      uVar22 = local_9a8;
    }
    if (uVar22 < (ulong)(local_9b0 + local_b50)) goto LAB_001d6ed5;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_9b8,0,(char *)0x0,(ulong)local_b58);
  }
  else {
LAB_001d6ed5:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b58,(ulong)local_9b8);
  }
  local_b38 = &local_b28;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_b28 = *puVar13;
    uStack_b20 = puVar10[3];
  }
  else {
    local_b28 = *puVar13;
    local_b38 = (ulong *)*puVar10;
  }
  local_b30 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b38);
  local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_b18.field_2._M_allocated_capacity = *puVar13;
    local_b18.field_2._8_8_ = plVar8[3];
  }
  else {
    local_b18.field_2._M_allocated_capacity = *puVar13;
    local_b18._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_b18._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_9d8 = &local_9c8;
  std::__cxx11::string::_M_construct((ulong)&local_9d8,'\x06');
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    uVar19 = local_b18.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_9d0 + local_b18._M_string_length) {
    uVar22 = 0xf;
    if (local_9d8 != &local_9c8) {
      uVar22 = local_9c8;
    }
    if (uVar22 < local_9d0 + local_b18._M_string_length) goto LAB_001d7032;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_9d8,0,(char *)0x0,(ulong)local_b18._M_dataplus._M_p);
  }
  else {
LAB_001d7032:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b18,(ulong)local_9d8);
  }
  local_ad8 = &local_ac8;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_ac8 = *puVar1;
    uStack_ac0 = puVar10[3];
  }
  else {
    local_ac8 = *puVar1;
    local_ad8 = (undefined8 *)*puVar10;
  }
  local_ad0 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_ad8);
  local_bd8 = &local_bc8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_bc8 = *puVar13;
    lStack_bc0 = plVar8[3];
  }
  else {
    local_bc8 = *puVar13;
    local_bd8 = (ulong *)*plVar8;
  }
  local_bd0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_a58 = &local_a48;
  std::__cxx11::string::_M_construct((ulong)&local_a58,'\x06');
  uVar22 = 0xf;
  if (local_bd8 != &local_bc8) {
    uVar22 = local_bc8;
  }
  if (uVar22 < (ulong)(local_a50 + local_bd0)) {
    uVar22 = 0xf;
    if (local_a58 != &local_a48) {
      uVar22 = local_a48;
    }
    if (uVar22 < (ulong)(local_a50 + local_bd0)) goto LAB_001d718f;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_a58,0,(char *)0x0,(ulong)local_bd8);
  }
  else {
LAB_001d718f:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bd8,(ulong)local_a58);
  }
  local_b78 = &local_b68;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_b68 = *puVar13;
    lStack_b60 = puVar10[3];
  }
  else {
    local_b68 = *puVar13;
    local_b78 = (ulong *)*puVar10;
  }
  local_b70 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b78);
  local_bb8 = &local_ba8;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_ba8 = *puVar13;
    uStack_ba0 = puVar10[3];
  }
  else {
    local_ba8 = *puVar13;
    local_bb8 = (ulong *)*puVar10;
  }
  local_bb0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_9f8 = &local_9e8;
  std::__cxx11::string::_M_construct((ulong)&local_9f8,'\x06');
  uVar22 = 0xf;
  if (local_bb8 != &local_ba8) {
    uVar22 = local_ba8;
  }
  if (uVar22 < (ulong)(local_9f0 + local_bb0)) {
    uVar22 = 0xf;
    if (local_9f8 != &local_9e8) {
      uVar22 = local_9e8;
    }
    if (uVar22 < (ulong)(local_9f0 + local_bb0)) goto LAB_001d72ec;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_9f8,0,(char *)0x0,(ulong)local_bb8);
  }
  else {
LAB_001d72ec:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bb8,(ulong)local_9f8);
  }
  local_af8 = &local_ae8;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_ae8 = *puVar13;
    lStack_ae0 = puVar10[3];
  }
  else {
    local_ae8 = *puVar13;
    local_af8 = (ulong *)*puVar10;
  }
  local_af0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_af8);
  local_b98 = &local_b88;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_b88 = *puVar13;
    lStack_b80 = plVar8[3];
  }
  else {
    local_b88 = *puVar13;
    local_b98 = (ulong *)*plVar8;
  }
  local_b90 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_a78 = &local_a68;
  std::__cxx11::string::_M_construct((ulong)&local_a78,'\x06');
  uVar22 = 0xf;
  if (local_b98 != &local_b88) {
    uVar22 = local_b88;
  }
  if (uVar22 < (ulong)(local_a70 + local_b90)) {
    uVar22 = 0xf;
    if (local_a78 != &local_a68) {
      uVar22 = local_a68;
    }
    if (uVar22 < (ulong)(local_a70 + local_b90)) goto LAB_001d7449;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_a78,0,(char *)0x0,(ulong)local_b98);
  }
  else {
LAB_001d7449:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b98,(ulong)local_a78);
  }
  local_bf8 = &local_be8;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_be8 = *puVar13;
    lStack_be0 = puVar10[3];
  }
  else {
    local_be8 = *puVar13;
    local_bf8 = (ulong *)*puVar10;
  }
  local_bf0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_bf8);
  local_c38 = &local_c28;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_c28 = *puVar13;
    lStack_c20 = plVar8[3];
  }
  else {
    local_c28 = *puVar13;
    local_c38 = (ulong *)*plVar8;
  }
  local_c30 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_a18 = &local_a08;
  std::__cxx11::string::_M_construct((ulong)&local_a18,'\x06');
  uVar22 = 0xf;
  if (local_c38 != &local_c28) {
    uVar22 = local_c28;
  }
  if (uVar22 < (ulong)(local_a10 + local_c30)) {
    uVar22 = 0xf;
    if (local_a18 != &local_a08) {
      uVar22 = local_a08;
    }
    if (uVar22 < (ulong)(local_a10 + local_c30)) goto LAB_001d75ae;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_a18,0,(char *)0x0,(ulong)local_c38);
  }
  else {
LAB_001d75ae:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c38,(ulong)local_a18);
  }
  local_c58 = &local_c48;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_c48 = *puVar13;
    lStack_c40 = puVar10[3];
  }
  else {
    local_c48 = *puVar13;
    local_c58 = (ulong *)*puVar10;
  }
  local_c50 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_c58);
  local_cb8 = &local_ca8;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_ca8 = *puVar13;
    uStack_ca0 = puVar10[3];
  }
  else {
    local_ca8 = *puVar13;
    local_cb8 = (ulong *)*puVar10;
  }
  local_cb0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_918 = &local_908;
  std::__cxx11::string::_M_construct((ulong)&local_918,'\t');
  uVar22 = 0xf;
  if (local_cb8 != &local_ca8) {
    uVar22 = local_ca8;
  }
  if (uVar22 < (ulong)(local_910 + local_cb0)) {
    uVar22 = 0xf;
    if (local_918 != &local_908) {
      uVar22 = local_908;
    }
    if (uVar22 < (ulong)(local_910 + local_cb0)) goto LAB_001d7713;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_918,0,(char *)0x0,(ulong)local_cb8);
  }
  else {
LAB_001d7713:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_cb8,(ulong)local_918);
  }
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_c08 = *puVar13;
    lStack_c00 = puVar10[3];
    local_c18 = &local_c08;
  }
  else {
    local_c08 = *puVar13;
    local_c18 = (ulong *)*puVar10;
  }
  local_c10 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c18);
  local_c78 = &local_c68;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_c68 = *puVar13;
    lStack_c60 = plVar8[3];
  }
  else {
    local_c68 = *puVar13;
    local_c78 = (ulong *)*plVar8;
  }
  local_c70 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_938 = &local_928;
  std::__cxx11::string::_M_construct((ulong)&local_938,'\t');
  uVar22 = 0xf;
  if (local_c78 != &local_c68) {
    uVar22 = local_c68;
  }
  if (uVar22 < (ulong)(local_930 + local_c70)) {
    uVar22 = 0xf;
    if (local_938 != &local_928) {
      uVar22 = local_928;
    }
    if (uVar22 < (ulong)(local_930 + local_c70)) goto LAB_001d7871;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_938,0,(char *)0x0,(ulong)local_c78);
  }
  else {
LAB_001d7871:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c78,(ulong)local_938);
  }
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  puVar13 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_d18.field_2._M_allocated_capacity = *puVar13;
    local_d18.field_2._8_8_ = puVar10[3];
  }
  else {
    local_d18.field_2._M_allocated_capacity = *puVar13;
    local_d18._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_d18._M_string_length = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d18);
  local_d78 = &local_d68;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_d68 = *puVar13;
    uStack_d60 = puVar10[3];
  }
  else {
    local_d68 = *puVar13;
    local_d78 = (ulong *)*puVar10;
  }
  local_d70 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  local_958 = &local_948;
  std::__cxx11::string::_M_construct((ulong)&local_958,'\x06');
  uVar22 = 0xf;
  if (local_d78 != &local_d68) {
    uVar22 = local_d68;
  }
  if (uVar22 < (ulong)(local_950 + local_d70)) {
    uVar22 = 0xf;
    if (local_958 != &local_948) {
      uVar22 = local_948;
    }
    if (uVar22 < (ulong)(local_950 + local_d70)) goto LAB_001d79d6;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_958,0,(char *)0x0,(ulong)local_d78);
  }
  else {
LAB_001d79d6:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d78,(ulong)local_958);
  }
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  psVar15 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_d38.field_2._M_allocated_capacity = *psVar15;
    local_d38.field_2._8_8_ = puVar10[3];
  }
  else {
    local_d38.field_2._M_allocated_capacity = *psVar15;
    local_d38._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_d38._M_string_length = puVar10[1];
  *puVar10 = psVar15;
  puVar10[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d38);
  local_db8 = &local_da8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_da8 = *puVar13;
    lStack_da0 = plVar8[3];
  }
  else {
    local_da8 = *puVar13;
    local_db8 = (ulong *)*plVar8;
  }
  local_db0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_978 = &local_968;
  std::__cxx11::string::_M_construct((ulong)&local_978,'\x06');
  uVar22 = 0xf;
  if (local_db8 != &local_da8) {
    uVar22 = local_da8;
  }
  if (uVar22 < (ulong)(local_970 + local_db0)) {
    uVar22 = 0xf;
    if (local_978 != &local_968) {
      uVar22 = local_968;
    }
    if (uVar22 < (ulong)(local_970 + local_db0)) goto LAB_001d7b3b;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_978,0,(char *)0x0,(ulong)local_db8);
  }
  else {
LAB_001d7b3b:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_db8,(ulong)local_978);
  }
  local_d98 = &local_d88;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_d88 = *puVar13;
    lStack_d80 = puVar10[3];
  }
  else {
    local_d88 = *puVar13;
    local_d98 = (ulong *)*puVar10;
  }
  local_d90 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d98);
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_e38.field_2._M_allocated_capacity = *puVar13;
    local_e38.field_2._8_8_ = plVar8[3];
  }
  else {
    local_e38.field_2._M_allocated_capacity = *puVar13;
    local_e38._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_e38._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_a98 = &local_a88;
  std::__cxx11::string::_M_construct((ulong)&local_a98,'\t');
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    uVar19 = local_e38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_a90 + local_e38._M_string_length) {
    uVar22 = 0xf;
    if (local_a98 != &local_a88) {
      uVar22 = local_a88;
    }
    if (uVar22 < local_a90 + local_e38._M_string_length) goto LAB_001d7c85;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_a98,0,(char *)0x0,(ulong)local_e38._M_dataplus._M_p);
  }
  else {
LAB_001d7c85:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e38,(ulong)local_a98);
  }
  local_dd8 = &local_dc8;
  plVar8 = puVar10 + 2;
  if ((long *)*puVar10 == plVar8) {
    local_dc8 = *plVar8;
    lStack_dc0 = puVar10[3];
  }
  else {
    local_dc8 = *plVar8;
    local_dd8 = (long *)*puVar10;
  }
  local_dd0 = puVar10[1];
  *puVar10 = plVar8;
  puVar10[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_dd8);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_df8.field_2._M_allocated_capacity = *puVar13;
    local_df8.field_2._8_8_ = plVar8[3];
    local_df8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_df8.field_2._M_allocated_capacity = *puVar13;
    local_df8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_df8._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_a38 = &local_a28;
  std::__cxx11::string::_M_construct((ulong)&local_a38,'\x06');
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != paVar2) {
    uVar19 = local_df8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_a30 + local_df8._M_string_length) {
    uVar22 = 0xf;
    if (local_a38 != &local_a28) {
      uVar22 = local_a28;
    }
    if (uVar22 < local_a30 + local_df8._M_string_length) goto LAB_001d7db8;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_a38,0,(char *)0x0,(ulong)local_df8._M_dataplus._M_p);
  }
  else {
LAB_001d7db8:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_df8,(ulong)local_a38);
  }
  psVar15 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_e08._M_allocated_capacity = *psVar15;
    local_e08._8_8_ = puVar10[3];
    local_e18 = &local_e08;
  }
  else {
    local_e08._M_allocated_capacity = *psVar15;
    local_e18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10;
  }
  local_e10 = puVar10[1];
  *puVar10 = psVar15;
  puVar10[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_e18);
  local_c98 = &local_c88;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_c88 = *puVar13;
    lStack_c80 = plVar8[3];
  }
  else {
    local_c88 = *puVar13;
    local_c98 = (ulong *)*plVar8;
  }
  local_c90 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_ab8 = &local_aa8;
  std::__cxx11::string::_M_construct((ulong)&local_ab8,'\x03');
  uVar22 = 0xf;
  if (local_c98 != &local_c88) {
    uVar22 = local_c88;
  }
  if (uVar22 < (ulong)(local_ab0 + local_c90)) {
    uVar22 = 0xf;
    if (local_ab8 != &local_aa8) {
      uVar22 = local_aa8;
    }
    if (uVar22 < (ulong)(local_ab0 + local_c90)) goto LAB_001d7f05;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_ab8,0,(char *)0x0,(ulong)local_c98);
  }
  else {
LAB_001d7f05:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c98,(ulong)local_ab8);
  }
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_d48 = *puVar13;
    lStack_d40 = puVar10[3];
    local_d58 = &local_d48;
  }
  else {
    local_d48 = *puVar13;
    local_d58 = (ulong *)*puVar10;
  }
  local_d50 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d58);
  psVar15 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_cd8.field_2._M_allocated_capacity = *psVar15;
    local_cd8.field_2._8_8_ = plVar8[3];
    local_cd8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_cd8.field_2._M_allocated_capacity = *psVar15;
    local_cd8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_cd8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8);
  }
  if (local_c98 != &local_c88) {
    operator_delete(local_c98);
  }
  if (local_e18 != &local_e08) {
    operator_delete(local_e18);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != paVar2) {
    operator_delete(local_df8._M_dataplus._M_p);
  }
  if (local_dd8 != &local_dc8) {
    operator_delete(local_dd8);
  }
  if (local_a98 != &local_a88) {
    operator_delete(local_a98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  if (local_d98 != &local_d88) {
    operator_delete(local_d98);
  }
  if (local_978 != &local_968) {
    operator_delete(local_978);
  }
  if (local_db8 != &local_da8) {
    operator_delete(local_db8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p);
  }
  if (local_958 != &local_948) {
    operator_delete(local_958);
  }
  if (local_d78 != &local_d68) {
    operator_delete(local_d78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p);
  }
  if (local_938 != &local_928) {
    operator_delete(local_938);
  }
  if (local_c78 != &local_c68) {
    operator_delete(local_c78);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18);
  }
  if (local_918 != &local_908) {
    operator_delete(local_918);
  }
  if (local_cb8 != &local_ca8) {
    operator_delete(local_cb8);
  }
  if (local_c58 != &local_c48) {
    operator_delete(local_c58);
  }
  if (local_a18 != &local_a08) {
    operator_delete(local_a18);
  }
  if (local_c38 != &local_c28) {
    operator_delete(local_c38);
  }
  if (local_bf8 != &local_be8) {
    operator_delete(local_bf8);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78);
  }
  if (local_b98 != &local_b88) {
    operator_delete(local_b98);
  }
  if (local_af8 != &local_ae8) {
    operator_delete(local_af8);
  }
  if (local_9f8 != &local_9e8) {
    operator_delete(local_9f8);
  }
  if (local_bb8 != &local_ba8) {
    operator_delete(local_bb8);
  }
  if (local_b78 != &local_b68) {
    operator_delete(local_b78);
  }
  if (local_a58 != &local_a48) {
    operator_delete(local_a58);
  }
  if (local_bd8 != &local_bc8) {
    operator_delete(local_bd8);
  }
  if (local_ad8 != &local_ac8) {
    operator_delete(local_ad8);
  }
  if (local_9d8 != &local_9c8) {
    operator_delete(local_9d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p);
  }
  if (local_b38 != &local_b28) {
    operator_delete(local_b38);
  }
  if (local_9b8 != &local_9a8) {
    operator_delete(local_9b8);
  }
  if (local_b58 != &local_b48) {
    operator_delete(local_b58);
  }
  if (local_998 != &local_988) {
    operator_delete(local_998);
  }
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8);
  }
  local_d58 = &local_d48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d58,"");
  local_c98 = &local_c88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c98,"");
  uVar22 = 0;
  do {
    if (((this->super_Application)._features.super__Base_bitset<2UL>._M_w[uVar22 >> 6] >>
         (uVar22 & 0x3f) & 1) != 0) {
      pAVar9 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          uVar22);
      if (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar22 >> 6]
          & 1L << ((byte)uVar22 & 0x3f)) == 0) {
        std::operator+(&local_d18,"+((tuple.",&pAVar9->_name);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d18);
        local_d78 = &local_d68;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_d68 = *puVar13;
          uStack_d60 = puVar10[3];
        }
        else {
          local_d68 = *puVar13;
          local_d78 = (ulong *)*puVar10;
        }
        local_d70 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_d78,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_d38.field_2._M_allocated_capacity = *psVar15;
          local_d38.field_2._8_8_ = puVar10[3];
        }
        else {
          local_d38.field_2._M_allocated_capacity = *psVar15;
          local_d38._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_d38._M_string_length = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d38);
        local_db8 = &local_da8;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_da8 = *puVar13;
          lStack_da0 = puVar10[3];
        }
        else {
          local_da8 = *puVar13;
          local_db8 = (ulong *)*puVar10;
        }
        local_db0 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_db8);
        local_d98 = &local_d88;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_d88 = *puVar13;
          lStack_d80 = puVar10[3];
        }
        else {
          local_d88 = *puVar13;
          local_d98 = (ulong *)*puVar10;
        }
        local_d90 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_d98,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_e38.field_2._M_allocated_capacity = *puVar13;
          local_e38.field_2._8_8_ = puVar10[3];
          local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
        }
        else {
          local_e38.field_2._M_allocated_capacity = *puVar13;
          local_e38._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_e38._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e38);
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_dc8 = *plVar8;
          lStack_dc0 = puVar10[3];
          local_dd8 = &local_dc8;
        }
        else {
          local_dc8 = *plVar8;
          local_dd8 = (long *)*puVar10;
        }
        local_dd0 = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_dd8,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_df8.field_2._M_allocated_capacity = *puVar13;
          local_df8.field_2._8_8_ = puVar10[3];
          local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
        }
        else {
          local_df8.field_2._M_allocated_capacity = *puVar13;
          local_df8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_df8._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_df8);
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_e08._M_allocated_capacity = *psVar15;
          local_e08._8_8_ = puVar10[3];
          local_e18 = &local_e08;
        }
        else {
          local_e08._M_allocated_capacity = *psVar15;
          local_e18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar10;
        }
        local_e10 = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_d58,(ulong)local_e18);
        if (local_e18 != &local_e08) {
          operator_delete(local_e18);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
        if (local_dd8 != &local_dc8) {
          operator_delete(local_dd8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          operator_delete(local_e38._M_dataplus._M_p);
        }
        if (local_d98 != &local_d88) {
          operator_delete(local_d98);
        }
        if (local_db8 != &local_da8) {
          operator_delete(local_db8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
          operator_delete(local_d38._M_dataplus._M_p);
        }
        if (local_d78 != &local_d68) {
          operator_delete(local_d78);
        }
        _Var18._M_p = local_d18._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d18._M_dataplus._M_p == &local_d18.field_2) goto LAB_001d9817;
      }
      else {
        uVar20 = **(ulong **)
                   &((*(this->varToQuery[uVar22]->_aggregates).
                       super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                       super__Vector_impl_data._M_start)->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ;
        cVar17 = '\x01';
        if (9 < uVar20) {
          uVar16 = uVar20;
          cVar6 = '\x04';
          do {
            cVar17 = cVar6;
            if (uVar16 < 100) {
              cVar17 = cVar17 + -2;
              goto LAB_001d88de;
            }
            if (uVar16 < 1000) {
              cVar17 = cVar17 + -1;
              goto LAB_001d88de;
            }
            if (uVar16 < 10000) goto LAB_001d88de;
            bVar4 = 99999 < uVar16;
            uVar16 = uVar16 / 10000;
            cVar6 = cVar17 + '\x04';
          } while (bVar4);
          cVar17 = cVar17 + '\x01';
        }
LAB_001d88de:
        local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_df8,cVar17);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_df8._M_dataplus._M_p,(uint)local_df8._M_string_length,uVar20);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_df8,0,(char *)0x0,0x2a5219);
        local_e18 = &local_e08;
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_e08._M_allocated_capacity = *psVar15;
          local_e08._8_8_ = puVar10[3];
        }
        else {
          local_e08._M_allocated_capacity = *psVar15;
          local_e18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar10;
        }
        local_e10 = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
        std::operator+(&local_d38,"-2*means[cluster].cluster_",&pAVar9->_name);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_d38);
        local_db8 = &local_da8;
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_da8 = *puVar13;
          lStack_da0 = plVar8[3];
        }
        else {
          local_da8 = *puVar13;
          local_db8 = (ulong *)*plVar8;
        }
        local_db0 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_db8,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        local_d98 = &local_d88;
        puVar13 = (ulong *)(plVar8 + 2);
        if ((ulong *)*plVar8 == puVar13) {
          local_d88 = *puVar13;
          lStack_d80 = plVar8[3];
        }
        else {
          local_d88 = *puVar13;
          local_d98 = (ulong *)*plVar8;
        }
        local_d90 = plVar8[1];
        *plVar8 = (long)puVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_d98);
        local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
        psVar15 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_e38.field_2._M_allocated_capacity = *psVar15;
          local_e38.field_2._8_8_ = plVar8[3];
        }
        else {
          local_e38.field_2._M_allocated_capacity = *psVar15;
          local_e38._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_e38._M_string_length = plVar8[1];
        *plVar8 = (long)psVar15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_e38,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        local_dd8 = &local_dc8;
        plVar12 = plVar8 + 2;
        if ((long *)*plVar8 == plVar12) {
          local_dc8 = *plVar12;
          lStack_dc0 = plVar8[3];
        }
        else {
          local_dc8 = *plVar12;
          local_dd8 = (long *)*plVar8;
        }
        local_dd0 = plVar8[1];
        *plVar8 = (long)plVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_dd8);
        local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
        psVar15 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_df8.field_2._M_allocated_capacity = *psVar15;
          local_df8.field_2._8_8_ = plVar8[3];
        }
        else {
          local_df8.field_2._M_allocated_capacity = *psVar15;
          local_df8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_df8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_d58,(ulong)local_df8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
        if (local_dd8 != &local_dc8) {
          operator_delete(local_dd8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          operator_delete(local_e38._M_dataplus._M_p);
        }
        if (local_d98 != &local_d88) {
          operator_delete(local_d98);
        }
        if (local_db8 != &local_da8) {
          operator_delete(local_db8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
          operator_delete(local_d38._M_dataplus._M_p);
        }
        local_ad8 = &local_ac8;
        std::__cxx11::string::_M_construct((ulong)&local_ad8,'\x06');
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_ad8,0,(char *)0x0,0x2afdd1);
        local_bd8 = &local_bc8;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_bc8 = *puVar13;
          lStack_bc0 = puVar10[3];
        }
        else {
          local_bc8 = *puVar13;
          local_bd8 = (ulong *)*puVar10;
        }
        local_bd0 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_bd8);
        local_b78 = &local_b68;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_b68 = *puVar13;
          lStack_b60 = puVar10[3];
        }
        else {
          local_b68 = *puVar13;
          local_b78 = (ulong *)*puVar10;
        }
        local_b70 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        Application::typeToStr_abi_cxx11_(&local_b18,&this->super_Application,pAVar9->_type);
        uVar20 = 0xf;
        if (local_b78 != &local_b68) {
          uVar20 = local_b68;
        }
        if (uVar20 < local_b18._M_string_length + local_b70) {
          uVar19 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
            uVar19 = local_b18.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar19 < local_b18._M_string_length + local_b70) goto LAB_001d8d96;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b18,0,(char *)0x0,(ulong)local_b78);
        }
        else {
LAB_001d8d96:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_b78,(ulong)local_b18._M_dataplus._M_p);
        }
        local_bb8 = &local_ba8;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_ba8 = *puVar13;
          uStack_ba0 = puVar10[3];
        }
        else {
          local_ba8 = *puVar13;
          local_bb8 = (ulong *)*puVar10;
        }
        local_bb0 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_bb8);
        local_af8 = &local_ae8;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_ae8 = *puVar13;
          lStack_ae0 = puVar10[3];
        }
        else {
          local_ae8 = *puVar13;
          local_af8 = (ulong *)*puVar10;
        }
        local_af0 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_af8,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        local_b98 = &local_b88;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_b88 = *puVar13;
          lStack_b80 = puVar10[3];
        }
        else {
          local_b88 = *puVar13;
          local_b98 = (ulong *)*puVar10;
        }
        local_b90 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_b98);
        local_bf8 = &local_be8;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_be8 = *puVar13;
          lStack_be0 = puVar10[3];
        }
        else {
          local_be8 = *puVar13;
          local_bf8 = (ulong *)*puVar10;
        }
        local_bf0 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bf8,(ulong)local_e18)
        ;
        local_c38 = &local_c28;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_c28 = *puVar13;
          lStack_c20 = puVar10[3];
        }
        else {
          local_c28 = *puVar13;
          local_c38 = (ulong *)*puVar10;
        }
        local_c30 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_c38);
        local_c58 = &local_c48;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_c48 = *puVar13;
          lStack_c40 = puVar10[3];
        }
        else {
          local_c48 = *puVar13;
          local_c58 = (ulong *)*puVar10;
        }
        local_c50 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        local_b38 = &local_b28;
        std::__cxx11::string::_M_construct((ulong)&local_b38,'\x06');
        uVar20 = 0xf;
        if (local_c58 != &local_c48) {
          uVar20 = local_c48;
        }
        if (uVar20 < (ulong)(local_b30 + local_c50)) {
          uVar20 = 0xf;
          if (local_b38 != &local_b28) {
            uVar20 = local_b28;
          }
          if (uVar20 < (ulong)(local_b30 + local_c50)) goto LAB_001d90a7;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_b38,0,(char *)0x0,(ulong)local_c58);
        }
        else {
LAB_001d90a7:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_c58,(ulong)local_b38);
        }
        local_cb8 = &local_ca8;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_ca8 = *puVar13;
          uStack_ca0 = puVar10[3];
        }
        else {
          local_ca8 = *puVar13;
          local_cb8 = (ulong *)*puVar10;
        }
        local_cb0 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_cb8);
        local_c18 = &local_c08;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_c08 = *puVar13;
          lStack_c00 = puVar10[3];
        }
        else {
          local_c08 = *puVar13;
          local_c18 = (ulong *)*puVar10;
        }
        local_c10 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c18,(ulong)local_e18)
        ;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_c68 = *puVar13;
          lStack_c60 = puVar10[3];
          local_c78 = &local_c68;
        }
        else {
          local_c68 = *puVar13;
          local_c78 = (ulong *)*puVar10;
        }
        local_c70 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_c78);
        local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_d18.field_2._M_allocated_capacity = *puVar13;
          local_d18.field_2._8_8_ = puVar10[3];
        }
        else {
          local_d18.field_2._M_allocated_capacity = *puVar13;
          local_d18._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_d18._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        local_b58 = &local_b48;
        std::__cxx11::string::_M_construct((ulong)&local_b58,'\t');
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
          uVar19 = local_d18.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < local_b50 + local_d18._M_string_length) {
          uVar20 = 0xf;
          if (local_b58 != &local_b48) {
            uVar20 = local_b48;
          }
          if (uVar20 < local_b50 + local_d18._M_string_length) goto LAB_001d92ea;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_b58,0,(char *)0x0,(ulong)local_d18._M_dataplus._M_p);
        }
        else {
LAB_001d92ea:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_d18,(ulong)local_b58);
        }
        local_d78 = &local_d68;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_d68 = *puVar13;
          uStack_d60 = puVar10[3];
        }
        else {
          local_d68 = *puVar13;
          local_d78 = (ulong *)*puVar10;
        }
        local_d70 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)puVar13 = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_d78,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        psVar15 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar15) {
          local_d38.field_2._M_allocated_capacity = *psVar15;
          local_d38.field_2._8_8_ = puVar10[3];
          local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
        }
        else {
          local_d38.field_2._M_allocated_capacity = *psVar15;
          local_d38._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_d38._M_string_length = puVar10[1];
        *puVar10 = psVar15;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d38);
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_da8 = *puVar13;
          lStack_da0 = puVar10[3];
          local_db8 = &local_da8;
        }
        else {
          local_da8 = *puVar13;
          local_db8 = (ulong *)*puVar10;
        }
        local_db0 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_db8,(ulong)local_e18)
        ;
        puVar13 = puVar10 + 2;
        if ((ulong *)*puVar10 == puVar13) {
          local_d88 = *puVar13;
          lStack_d80 = puVar10[3];
          local_d98 = &local_d88;
        }
        else {
          local_d88 = *puVar13;
          local_d98 = (ulong *)*puVar10;
        }
        local_d90 = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d98);
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_e38.field_2._M_allocated_capacity = *puVar13;
          local_e38.field_2._8_8_ = puVar10[3];
          local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
        }
        else {
          local_e38.field_2._M_allocated_capacity = *puVar13;
          local_e38._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_e38._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_e38,(ulong)(pAVar9->_name)._M_dataplus._M_p);
        plVar8 = puVar10 + 2;
        if ((long *)*puVar10 == plVar8) {
          local_dc8 = *plVar8;
          lStack_dc0 = puVar10[3];
          local_dd8 = &local_dc8;
        }
        else {
          local_dc8 = *plVar8;
          local_dd8 = (long *)*puVar10;
        }
        local_dd0 = puVar10[1];
        *puVar10 = plVar8;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_dd8);
        puVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_df8.field_2._M_allocated_capacity = *puVar13;
          local_df8.field_2._8_8_ = puVar10[3];
          local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
        }
        else {
          local_df8.field_2._M_allocated_capacity = *puVar13;
          local_df8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_df8._M_string_length = puVar10[1];
        *puVar10 = puVar13;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_c98,(ulong)local_df8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
        if (local_dd8 != &local_dc8) {
          operator_delete(local_dd8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
          operator_delete(local_e38._M_dataplus._M_p);
        }
        if (local_d98 != &local_d88) {
          operator_delete(local_d98);
        }
        if (local_db8 != &local_da8) {
          operator_delete(local_db8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
          operator_delete(local_d38._M_dataplus._M_p);
        }
        if (local_d78 != &local_d68) {
          operator_delete(local_d78);
        }
        if (local_b58 != &local_b48) {
          operator_delete(local_b58);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
          operator_delete(local_d18._M_dataplus._M_p);
        }
        if (local_c78 != &local_c68) {
          operator_delete(local_c78);
        }
        if (local_c18 != &local_c08) {
          operator_delete(local_c18);
        }
        if (local_cb8 != &local_ca8) {
          operator_delete(local_cb8);
        }
        if (local_b38 != &local_b28) {
          operator_delete(local_b38);
        }
        if (local_c58 != &local_c48) {
          operator_delete(local_c58);
        }
        if (local_c38 != &local_c28) {
          operator_delete(local_c38);
        }
        if (local_bf8 != &local_be8) {
          operator_delete(local_bf8);
        }
        if (local_b98 != &local_b88) {
          operator_delete(local_b98);
        }
        if (local_af8 != &local_ae8) {
          operator_delete(local_af8);
        }
        if (local_bb8 != &local_ba8) {
          operator_delete(local_bb8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
          operator_delete(local_b18._M_dataplus._M_p);
        }
        if (local_b78 != &local_b68) {
          operator_delete(local_b78);
        }
        if (local_bd8 != &local_bc8) {
          operator_delete(local_bd8);
        }
        if (local_ad8 != &local_ac8) {
          operator_delete(local_ad8);
        }
        _Var18._M_p = (pointer)local_e18;
        if (local_e18 == &local_e08) goto LAB_001d9817;
      }
      operator_delete(_Var18._M_p);
    }
LAB_001d9817:
    uVar22 = uVar22 + 1;
  } while (uVar22 != 100);
  lVar21 = 0;
  uVar22 = 0;
  local_e18 = &local_e08;
  bVar4 = true;
  do {
    bVar7 = bVar4;
    uVar20 = (this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[lVar21];
    uVar20 = uVar20 - (uVar20 >> 1 & 0x5555555555555555);
    uVar20 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333);
    uVar22 = uVar22 + (((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    lVar21 = 1;
    bVar4 = false;
  } while (bVar7);
  cVar17 = '\x01';
  if (0x13 < uVar22) {
    uVar20 = uVar22 >> 1;
    cVar6 = '\x04';
    do {
      cVar17 = cVar6;
      if (uVar20 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_001d9908;
      }
      if (uVar20 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_001d9908;
      }
      if (uVar20 < 10000) goto LAB_001d9908;
      bVar4 = 99999 < uVar20;
      uVar20 = uVar20 / 10000;
      cVar6 = cVar17 + '\x04';
    } while (bVar4);
    cVar17 = cVar17 + '\x01';
  }
LAB_001d9908:
  std::__cxx11::string::_M_construct((ulong)&local_e18,cVar17);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_e18->_M_local_buf,(uint)local_e10,uVar22 >> 1);
  local_df8._M_dataplus._M_p = (pointer)&local_df8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_df8,"");
  local_c58 = (ulong *)0x0;
  do {
    if ((((this->clusterVariables).super__Base_bitset<2UL>._M_w[(ulong)local_c58 >> 6] >>
          ((ulong)local_c58 & 0x3f) & 1) != 0) &&
       (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w
         [(ulong)local_c58 >> 6] & 1L << ((byte)local_c58 & 0x3f)) != 0)) {
      pmVar11 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&clusterToVariableMap,(key_type *)&local_c58);
      uVar22 = **(ulong **)
                 &((*(this->varToQuery[*pmVar11]->_aggregates).
                     super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                     super__Vector_impl_data._M_start)->_incoming).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ;
      cVar17 = '\x01';
      if (9 < uVar22) {
        uVar20 = uVar22;
        cVar6 = '\x04';
        do {
          cVar17 = cVar6;
          if (uVar20 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_001d9a1f;
          }
          if (uVar20 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_001d9a1f;
          }
          if (uVar20 < 10000) goto LAB_001d9a1f;
          bVar4 = 99999 < uVar20;
          uVar20 = uVar20 / 10000;
          cVar6 = cVar17 + '\x04';
        } while (bVar4);
        cVar17 = cVar17 + '\x01';
      }
LAB_001d9a1f:
      local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_e38,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_e38._M_dataplus._M_p,(uint)local_e38._M_string_length,uVar22);
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_e38,0,(char *)0x0,0x2a5219);
      local_dd8 = &local_dc8;
      plVar8 = puVar10 + 2;
      if ((long *)*puVar10 == plVar8) {
        local_dc8 = *plVar8;
        lStack_dc0 = puVar10[3];
      }
      else {
        local_dc8 = *plVar8;
        local_dd8 = (long *)*puVar10;
      }
      local_dd0 = puVar10[1];
      *puVar10 = plVar8;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p);
      }
      pAVar9 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (size_t)local_c58);
      local_c18 = &local_c08;
      std::__cxx11::string::_M_construct((ulong)&local_c18,'\t');
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_c18);
      local_c78 = &local_c68;
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_c68 = *puVar13;
        lStack_c60 = puVar10[3];
      }
      else {
        local_c68 = *puVar13;
        local_c78 = (ulong *)*puVar10;
      }
      local_c70 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c78,(ulong)local_dd8);
      puVar13 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_d18.field_2._M_allocated_capacity = *puVar13;
        local_d18.field_2._8_8_ = puVar10[3];
        local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
      }
      else {
        local_d18.field_2._M_allocated_capacity = *puVar13;
        local_d18._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_d18._M_string_length = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d18);
      local_d78 = &local_d68;
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_d68 = *puVar13;
        uStack_d60 = puVar10[3];
      }
      else {
        local_d68 = *puVar13;
        local_d78 = (ulong *)*puVar10;
      }
      local_d70 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      local_cb8 = &local_ca8;
      std::__cxx11::string::_M_construct((ulong)&local_cb8,'\f');
      uVar22 = 0xf;
      if (local_d78 != &local_d68) {
        uVar22 = local_d68;
      }
      if (uVar22 < (ulong)(local_cb0 + local_d70)) {
        uVar22 = 0xf;
        if (local_cb8 != &local_ca8) {
          uVar22 = local_ca8;
        }
        if (uVar22 < (ulong)(local_cb0 + local_d70)) goto LAB_001d9cb3;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_cb8,0,(char *)0x0,(ulong)local_d78);
      }
      else {
LAB_001d9cb3:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d78,(ulong)local_cb8)
        ;
      }
      local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
      psVar15 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_d38.field_2._M_allocated_capacity = *psVar15;
        local_d38.field_2._8_8_ = puVar10[3];
      }
      else {
        local_d38.field_2._M_allocated_capacity = *psVar15;
        local_d38._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_d38._M_string_length = puVar10[1];
      *puVar10 = psVar15;
      puVar10[1] = 0;
      *(undefined1 *)psVar15 = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d38);
      local_db8 = &local_da8;
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_da8 = *puVar13;
        lStack_da0 = puVar10[3];
      }
      else {
        local_da8 = *puVar13;
        local_db8 = (ulong *)*puVar10;
      }
      local_db0 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_db8,(ulong)(pAVar9->_name)._M_dataplus._M_p);
      local_d98 = &local_d88;
      puVar13 = puVar10 + 2;
      if ((ulong *)*puVar10 == puVar13) {
        local_d88 = *puVar13;
        lStack_d80 = puVar10[3];
      }
      else {
        local_d88 = *puVar13;
        local_d98 = (ulong *)*puVar10;
      }
      local_d90 = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_d98);
      local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
      puVar13 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_e38.field_2._M_allocated_capacity = *puVar13;
        local_e38.field_2._8_8_ = puVar10[3];
      }
      else {
        local_e38.field_2._M_allocated_capacity = *puVar13;
        local_e38._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_e38._M_string_length = puVar10[1];
      *puVar10 = puVar13;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_df8,(ulong)local_e38._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
        operator_delete(local_e38._M_dataplus._M_p);
      }
      if (local_d98 != &local_d88) {
        operator_delete(local_d98);
      }
      if (local_db8 != &local_da8) {
        operator_delete(local_db8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
        operator_delete(local_d38._M_dataplus._M_p);
      }
      if (local_cb8 != &local_ca8) {
        operator_delete(local_cb8);
      }
      if (local_d78 != &local_d68) {
        operator_delete(local_d78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
        operator_delete(local_d18._M_dataplus._M_p);
      }
      if (local_c78 != &local_c68) {
        operator_delete(local_c78);
      }
      if (local_c18 != &local_c08) {
        operator_delete(local_c18);
      }
      if (local_dd8 != &local_dc8) {
        operator_delete(local_dd8);
      }
    }
    local_c58 = (ulong *)((long)local_c58 + 1);
  } while (local_c58 < (ulong *)0x64);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x03');
  plVar8 = (long *)std::__cxx11::string::append((char *)local_50);
  local_8b8 = &local_8a8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_8a8 = *puVar13;
    lStack_8a0 = plVar8[3];
  }
  else {
    local_8a8 = *puVar13;
    local_8b8 = (ulong *)*plVar8;
  }
  local_8b0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_3b8 = local_3a8;
  std::__cxx11::string::_M_construct((ulong)&local_3b8,'\x03');
  uVar22 = 0xf;
  if (local_8b8 != &local_8a8) {
    uVar22 = local_8a8;
  }
  if (uVar22 < (ulong)(local_3b0 + local_8b0)) {
    uVar22 = 0xf;
    if (local_3b8 != local_3a8) {
      uVar22 = local_3a8[0];
    }
    if (uVar22 < (ulong)(local_3b0 + local_8b0)) goto LAB_001da0b3;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3b8,0,(char *)0x0,(ulong)local_8b8);
  }
  else {
LAB_001da0b3:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8b8,(ulong)local_3b8);
  }
  local_398 = &local_388;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_388 = *puVar1;
    uStack_380 = puVar10[3];
  }
  else {
    local_388 = *puVar1;
    local_398 = (undefined8 *)*puVar10;
  }
  local_390 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_398);
  local_898 = &local_888;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_888 = *puVar13;
    lStack_880 = plVar8[3];
  }
  else {
    local_888 = *puVar13;
    local_898 = (ulong *)*plVar8;
  }
  local_890 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_3d8 = local_3c8;
  std::__cxx11::string::_M_construct((ulong)&local_3d8,'\x06');
  uVar22 = 0xf;
  if (local_898 != &local_888) {
    uVar22 = local_888;
  }
  if (uVar22 < (ulong)(local_3d0 + local_890)) {
    uVar22 = 0xf;
    if (local_3d8 != local_3c8) {
      uVar22 = local_3c8[0];
    }
    if (uVar22 < (ulong)(local_3d0 + local_890)) goto LAB_001da210;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3d8,0,(char *)0x0,(ulong)local_898);
  }
  else {
LAB_001da210:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_898,(ulong)local_3d8);
  }
  local_378 = &local_368;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_368 = *puVar1;
    uStack_360 = puVar10[3];
  }
  else {
    local_368 = *puVar1;
    local_378 = (undefined8 *)*puVar10;
  }
  local_370 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_378);
  local_878 = &local_868;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_868 = *puVar13;
    lStack_860 = plVar8[3];
  }
  else {
    local_868 = *puVar13;
    local_878 = (ulong *)*plVar8;
  }
  local_870 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_3f8 = local_3e8;
  std::__cxx11::string::_M_construct((ulong)&local_3f8,'\x06');
  uVar22 = 0xf;
  if (local_878 != &local_868) {
    uVar22 = local_868;
  }
  if (uVar22 < (ulong)(local_3f0 + local_870)) {
    uVar22 = 0xf;
    if (local_3f8 != local_3e8) {
      uVar22 = local_3e8[0];
    }
    if (uVar22 < (ulong)(local_3f0 + local_870)) goto LAB_001da36d;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3f8,0,(char *)0x0,(ulong)local_878);
  }
  else {
LAB_001da36d:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_878,(ulong)local_3f8);
  }
  local_358 = &local_348;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_348 = *puVar1;
    uStack_340 = puVar10[3];
  }
  else {
    local_348 = *puVar1;
    local_358 = (undefined8 *)*puVar10;
  }
  local_350 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_358);
  local_858 = &local_848;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_848 = *puVar13;
    lStack_840 = plVar8[3];
  }
  else {
    local_848 = *puVar13;
    local_858 = (ulong *)*plVar8;
  }
  local_850 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_418 = local_408;
  std::__cxx11::string::_M_construct((ulong)&local_418,'\x06');
  uVar22 = 0xf;
  if (local_858 != &local_848) {
    uVar22 = local_848;
  }
  if (uVar22 < (ulong)(local_410 + local_850)) {
    uVar22 = 0xf;
    if (local_418 != local_408) {
      uVar22 = local_408[0];
    }
    if (uVar22 < (ulong)(local_410 + local_850)) goto LAB_001da4ca;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_418,0,(char *)0x0,(ulong)local_858);
  }
  else {
LAB_001da4ca:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_858,(ulong)local_418);
  }
  local_338 = &local_328;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_328 = *puVar1;
    uStack_320 = puVar10[3];
  }
  else {
    local_328 = *puVar1;
    local_338 = (undefined8 *)*puVar10;
  }
  local_330 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_338);
  local_d0 = &local_c0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_c0 = *plVar12;
    lStack_b8 = plVar8[3];
  }
  else {
    local_c0 = *plVar12;
    local_d0 = (long *)*plVar8;
  }
  local_c8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_c98);
  local_b0 = &local_a0;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_a0 = *plVar12;
    lStack_98 = plVar8[3];
  }
  else {
    local_a0 = *plVar12;
    local_b0 = (long *)*plVar8;
  }
  local_a8 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_838 = &local_828;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_828 = *puVar13;
    lStack_820 = plVar8[3];
  }
  else {
    local_828 = *puVar13;
    local_838 = (ulong *)*plVar8;
  }
  local_830 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_438 = local_428;
  std::__cxx11::string::_M_construct((ulong)&local_438,'\x06');
  uVar22 = 0xf;
  if (local_838 != &local_828) {
    uVar22 = local_828;
  }
  if (uVar22 < (ulong)(local_430 + local_830)) {
    uVar22 = 0xf;
    if (local_438 != local_428) {
      uVar22 = local_428[0];
    }
    if (uVar22 < (ulong)(local_430 + local_830)) goto LAB_001da6f2;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_438,0,(char *)0x0,(ulong)local_838);
  }
  else {
LAB_001da6f2:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_838,(ulong)local_438);
  }
  local_318 = &local_308;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_308 = *puVar1;
    uStack_300 = puVar10[3];
  }
  else {
    local_308 = *puVar1;
    local_318 = (undefined8 *)*puVar10;
  }
  local_310 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_318);
  local_818 = &local_808;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_808 = *puVar13;
    lStack_800 = plVar8[3];
  }
  else {
    local_808 = *puVar13;
    local_818 = (ulong *)*plVar8;
  }
  local_810 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_458 = local_448;
  std::__cxx11::string::_M_construct((ulong)&local_458,'\x06');
  uVar22 = 0xf;
  if (local_818 != &local_808) {
    uVar22 = local_808;
  }
  if (uVar22 < (ulong)(local_450 + local_810)) {
    uVar22 = 0xf;
    if (local_458 != local_448) {
      uVar22 = local_448[0];
    }
    if (uVar22 < (ulong)(local_450 + local_810)) goto LAB_001da84f;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_458,0,(char *)0x0,(ulong)local_818);
  }
  else {
LAB_001da84f:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_818,(ulong)local_458);
  }
  local_2f8 = &local_2e8;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_2e8 = *puVar1;
    uStack_2e0 = puVar10[3];
  }
  else {
    local_2e8 = *puVar1;
    local_2f8 = (undefined8 *)*puVar10;
  }
  local_2f0 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  local_7f8 = &local_7e8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_7e8 = *puVar13;
    lStack_7e0 = plVar8[3];
  }
  else {
    local_7e8 = *puVar13;
    local_7f8 = (ulong *)*plVar8;
  }
  local_7f0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_478 = local_468;
  std::__cxx11::string::_M_construct((ulong)&local_478,'\x06');
  uVar22 = 0xf;
  if (local_7f8 != &local_7e8) {
    uVar22 = local_7e8;
  }
  if (uVar22 < (ulong)(local_470 + local_7f0)) {
    uVar22 = 0xf;
    if (local_478 != local_468) {
      uVar22 = local_468[0];
    }
    if (uVar22 < (ulong)(local_470 + local_7f0)) goto LAB_001da9ac;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_478,0,(char *)0x0,(ulong)local_7f8);
  }
  else {
LAB_001da9ac:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7f8,(ulong)local_478);
  }
  local_2d8 = &local_2c8;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_2c8 = *puVar1;
    uStack_2c0 = puVar10[3];
  }
  else {
    local_2c8 = *puVar1;
    local_2d8 = (undefined8 *)*puVar10;
  }
  local_2d0 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_7d8 = &local_7c8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_7c8 = *puVar13;
    lStack_7c0 = plVar8[3];
  }
  else {
    local_7c8 = *puVar13;
    local_7d8 = (ulong *)*plVar8;
  }
  local_7d0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_498 = local_488;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\t');
  uVar22 = 0xf;
  if (local_7d8 != &local_7c8) {
    uVar22 = local_7c8;
  }
  if (uVar22 < (ulong)(local_490 + local_7d0)) {
    uVar22 = 0xf;
    if (local_498 != local_488) {
      uVar22 = local_488[0];
    }
    if (uVar22 < (ulong)(local_490 + local_7d0)) goto LAB_001dab09;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_498,0,(char *)0x0,(ulong)local_7d8);
  }
  else {
LAB_001dab09:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7d8,(ulong)local_498);
  }
  local_2b8 = &local_2a8;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_2a8 = *puVar1;
    uStack_2a0 = puVar10[3];
  }
  else {
    local_2a8 = *puVar1;
    local_2b8 = (undefined8 *)*puVar10;
  }
  local_2b0 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_90 = &local_80;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_80 = *plVar12;
    lStack_78 = plVar8[3];
  }
  else {
    local_80 = *plVar12;
    local_90 = (long *)*plVar8;
  }
  local_88 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)local_df8._M_dataplus._M_p);
  local_7b8 = &local_7a8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_7a8 = *puVar13;
    lStack_7a0 = plVar8[3];
  }
  else {
    local_7a8 = *puVar13;
    local_7b8 = (ulong *)*plVar8;
  }
  local_7b0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_4b8 = local_4a8;
  std::__cxx11::string::_M_construct((ulong)&local_4b8,'\x06');
  uVar22 = 0xf;
  if (local_7b8 != &local_7a8) {
    uVar22 = local_7a8;
  }
  if (uVar22 < (ulong)(local_4b0 + local_7b0)) {
    uVar22 = 0xf;
    if (local_4b8 != local_4a8) {
      uVar22 = local_4a8[0];
    }
    if (uVar22 < (ulong)(local_4b0 + local_7b0)) goto LAB_001dacca;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4b8,0,(char *)0x0,(ulong)local_7b8);
  }
  else {
LAB_001dacca:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_7b8,(ulong)local_4b8);
  }
  local_298 = &local_288;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_288 = *puVar1;
    uStack_280 = puVar10[3];
  }
  else {
    local_288 = *puVar1;
    local_298 = (undefined8 *)*puVar10;
  }
  local_290 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_798 = &local_788;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_788 = *puVar13;
    lStack_780 = plVar8[3];
  }
  else {
    local_788 = *puVar13;
    local_798 = (ulong *)*plVar8;
  }
  local_790 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_4d8 = local_4c8;
  std::__cxx11::string::_M_construct((ulong)&local_4d8,'\x06');
  uVar22 = 0xf;
  if (local_798 != &local_788) {
    uVar22 = local_788;
  }
  if (uVar22 < (ulong)(local_4d0 + local_790)) {
    uVar22 = 0xf;
    if (local_4d8 != local_4c8) {
      uVar22 = local_4c8[0];
    }
    if (uVar22 < (ulong)(local_4d0 + local_790)) goto LAB_001dae27;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4d8,0,(char *)0x0,(ulong)local_798);
  }
  else {
LAB_001dae27:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_798,(ulong)local_4d8);
  }
  local_278 = &local_268;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_268 = *puVar1;
    uStack_260 = puVar10[3];
  }
  else {
    local_268 = *puVar1;
    local_278 = (undefined8 *)*puVar10;
  }
  local_270 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_70 = &local_60;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_60 = *plVar12;
    lStack_58 = plVar8[3];
  }
  else {
    local_60 = *plVar12;
    local_70 = (long *)*plVar8;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_778 = &local_768;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_768 = *puVar13;
    lStack_760 = plVar8[3];
  }
  else {
    local_768 = *puVar13;
    local_778 = (ulong *)*plVar8;
  }
  local_770 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_4f8 = local_4e8;
  std::__cxx11::string::_M_construct((ulong)&local_4f8,'\x06');
  uVar22 = 0xf;
  if (local_778 != &local_768) {
    uVar22 = local_768;
  }
  if (uVar22 < (ulong)(local_4f0 + local_770)) {
    uVar22 = 0xf;
    if (local_4f8 != local_4e8) {
      uVar22 = local_4e8[0];
    }
    if (uVar22 < (ulong)(local_4f0 + local_770)) goto LAB_001dafe5;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,(ulong)local_778);
  }
  else {
LAB_001dafe5:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_778,(ulong)local_4f8);
  }
  local_258 = &local_248;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_248 = *puVar1;
    uStack_240 = puVar10[3];
  }
  else {
    local_248 = *puVar1;
    local_258 = (undefined8 *)*puVar10;
  }
  local_250 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_758 = &local_748;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_748 = *puVar13;
    lStack_740 = plVar8[3];
  }
  else {
    local_748 = *puVar13;
    local_758 = (ulong *)*plVar8;
  }
  local_750 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_518 = local_508;
  std::__cxx11::string::_M_construct((ulong)&local_518,'\x06');
  uVar22 = 0xf;
  if (local_758 != &local_748) {
    uVar22 = local_748;
  }
  if (uVar22 < (ulong)(local_510 + local_750)) {
    uVar22 = 0xf;
    if (local_518 != local_508) {
      uVar22 = local_508[0];
    }
    if (uVar22 < (ulong)(local_510 + local_750)) goto LAB_001db142;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,(ulong)local_758);
  }
  else {
LAB_001db142:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_758,(ulong)local_518);
  }
  local_238 = &local_228;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_228 = *puVar1;
    uStack_220 = puVar10[3];
  }
  else {
    local_228 = *puVar1;
    local_238 = (undefined8 *)*puVar10;
  }
  local_230 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
  local_738 = &local_728;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_728 = *puVar13;
    lStack_720 = plVar8[3];
  }
  else {
    local_728 = *puVar13;
    local_738 = (ulong *)*plVar8;
  }
  local_730 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_538 = local_528;
  std::__cxx11::string::_M_construct((ulong)&local_538,'\t');
  uVar22 = 0xf;
  if (local_738 != &local_728) {
    uVar22 = local_728;
  }
  if (uVar22 < (ulong)(local_530 + local_730)) {
    uVar22 = 0xf;
    if (local_538 != local_528) {
      uVar22 = local_528[0];
    }
    if (uVar22 < (ulong)(local_530 + local_730)) goto LAB_001db29f;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_538,0,(char *)0x0,(ulong)local_738);
  }
  else {
LAB_001db29f:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_738,(ulong)local_538);
  }
  local_218 = &local_208;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_208 = *puVar1;
    uStack_200 = puVar10[3];
  }
  else {
    local_208 = *puVar1;
    local_218 = (undefined8 *)*puVar10;
  }
  local_210 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_218);
  local_718 = &local_708;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_708 = *puVar13;
    lStack_700 = plVar8[3];
  }
  else {
    local_708 = *puVar13;
    local_718 = (ulong *)*plVar8;
  }
  local_710 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_558 = local_548;
  std::__cxx11::string::_M_construct((ulong)&local_558,'\t');
  uVar22 = 0xf;
  if (local_718 != &local_708) {
    uVar22 = local_708;
  }
  if (uVar22 < (ulong)(local_550 + local_710)) {
    uVar22 = 0xf;
    if (local_558 != local_548) {
      uVar22 = local_548[0];
    }
    if (uVar22 < (ulong)(local_550 + local_710)) goto LAB_001db3fc;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,(ulong)local_718);
  }
  else {
LAB_001db3fc:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_718,(ulong)local_558);
  }
  local_1f8 = &local_1e8;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_1e8 = *puVar1;
    uStack_1e0 = puVar10[3];
  }
  else {
    local_1e8 = *puVar1;
    local_1f8 = (undefined8 *)*puVar10;
  }
  local_1f0 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f8);
  local_6f8 = &local_6e8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_6e8 = *puVar13;
    lStack_6e0 = plVar8[3];
  }
  else {
    local_6e8 = *puVar13;
    local_6f8 = (ulong *)*plVar8;
  }
  local_6f0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_578 = local_568;
  std::__cxx11::string::_M_construct((ulong)&local_578,'\t');
  uVar22 = 0xf;
  if (local_6f8 != &local_6e8) {
    uVar22 = local_6e8;
  }
  if (uVar22 < (ulong)(local_570 + local_6f0)) {
    uVar22 = 0xf;
    if (local_578 != local_568) {
      uVar22 = local_568[0];
    }
    if (uVar22 < (ulong)(local_570 + local_6f0)) goto LAB_001db559;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_578,0,(char *)0x0,(ulong)local_6f8);
  }
  else {
LAB_001db559:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6f8,(ulong)local_578);
  }
  local_1d8 = &local_1c8;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_1c8 = *puVar1;
    uStack_1c0 = puVar10[3];
  }
  else {
    local_1c8 = *puVar1;
    local_1d8 = (undefined8 *)*puVar10;
  }
  local_1d0 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_6d8 = &local_6c8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_6c8 = *puVar13;
    lStack_6c0 = plVar8[3];
  }
  else {
    local_6c8 = *puVar13;
    local_6d8 = (ulong *)*plVar8;
  }
  local_6d0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_598 = local_588;
  std::__cxx11::string::_M_construct((ulong)&local_598,'\t');
  uVar22 = 0xf;
  if (local_6d8 != &local_6c8) {
    uVar22 = local_6c8;
  }
  if (uVar22 < (ulong)(local_590 + local_6d0)) {
    uVar22 = 0xf;
    if (local_598 != local_588) {
      uVar22 = local_588[0];
    }
    if (uVar22 < (ulong)(local_590 + local_6d0)) goto LAB_001db6b6;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_598,0,(char *)0x0,(ulong)local_6d8);
  }
  else {
LAB_001db6b6:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_6d8,(ulong)local_598);
  }
  local_ab8 = &local_aa8;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_aa8 = *puVar13;
    uStack_aa0 = puVar10[3];
  }
  else {
    local_aa8 = *puVar13;
    local_ab8 = (ulong *)*puVar10;
  }
  local_ab0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_ab8);
  local_a38 = &local_a28;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_a28 = *puVar13;
    lStack_a20 = plVar8[3];
  }
  else {
    local_a28 = *puVar13;
    local_a38 = (ulong *)*plVar8;
  }
  local_a30 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_5b8 = local_5a8;
  std::__cxx11::string::_M_construct((ulong)&local_5b8,'\f');
  uVar22 = 0xf;
  if (local_a38 != &local_a28) {
    uVar22 = local_a28;
  }
  if (uVar22 < (ulong)(local_5b0 + local_a30)) {
    uVar22 = 0xf;
    if (local_5b8 != local_5a8) {
      uVar22 = local_5a8[0];
    }
    if (uVar22 < (ulong)(local_5b0 + local_a30)) goto LAB_001db81b;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5b8,0,(char *)0x0,(ulong)local_a38);
  }
  else {
LAB_001db81b:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a38,(ulong)local_5b8);
  }
  local_a98 = &local_a88;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_a88 = *puVar13;
    uStack_a80 = puVar10[3];
  }
  else {
    local_a88 = *puVar13;
    local_a98 = (ulong *)*puVar10;
  }
  local_a90 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_a98);
  local_978 = &local_968;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_968 = *puVar13;
    lStack_960 = plVar8[3];
  }
  else {
    local_968 = *puVar13;
    local_978 = (ulong *)*plVar8;
  }
  local_970 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_978,(ulong)local_e18);
  local_958 = &local_948;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_948 = *puVar13;
    lStack_940 = plVar8[3];
  }
  else {
    local_948 = *puVar13;
    local_958 = (ulong *)*plVar8;
  }
  local_950 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_958);
  local_938 = &local_928;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_928 = *puVar13;
    lStack_920 = plVar8[3];
  }
  else {
    local_928 = *puVar13;
    local_938 = (ulong *)*plVar8;
  }
  local_930 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_938,(ulong)local_d58);
  local_918 = &local_908;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_908 = *puVar13;
    lStack_900 = plVar8[3];
  }
  else {
    local_908 = *puVar13;
    local_918 = (ulong *)*plVar8;
  }
  local_910 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_918);
  local_a18 = &local_a08;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_a08 = *puVar13;
    lStack_a00 = plVar8[3];
  }
  else {
    local_a08 = *puVar13;
    local_a18 = (ulong *)*plVar8;
  }
  local_a10 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_5d8 = local_5c8;
  std::__cxx11::string::_M_construct((ulong)&local_5d8,'\f');
  uVar22 = 0xf;
  if (local_a18 != &local_a08) {
    uVar22 = local_a08;
  }
  if (uVar22 < (ulong)(local_5d0 + local_a10)) {
    uVar22 = 0xf;
    if (local_5d8 != local_5c8) {
      uVar22 = local_5c8[0];
    }
    if (uVar22 < (ulong)(local_5d0 + local_a10)) goto LAB_001dbb20;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5d8,0,(char *)0x0,(ulong)local_a18);
  }
  else {
LAB_001dbb20:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a18,(ulong)local_5d8);
  }
  local_a78 = &local_a68;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_a68 = *puVar13;
    uStack_a60 = puVar10[3];
  }
  else {
    local_a68 = *puVar13;
    local_a78 = (ulong *)*puVar10;
  }
  local_a70 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_a78);
  local_9f8 = &local_9e8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_9e8 = *puVar13;
    lStack_9e0 = plVar8[3];
  }
  else {
    local_9e8 = *puVar13;
    local_9f8 = (ulong *)*plVar8;
  }
  local_9f0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_5f8 = local_5e8;
  std::__cxx11::string::_M_construct((ulong)&local_5f8,'\f');
  uVar22 = 0xf;
  if (local_9f8 != &local_9e8) {
    uVar22 = local_9e8;
  }
  if (uVar22 < (ulong)(local_5f0 + local_9f0)) {
    uVar22 = 0xf;
    if (local_5f8 != local_5e8) {
      uVar22 = local_5e8[0];
    }
    if (uVar22 < (ulong)(local_5f0 + local_9f0)) goto LAB_001dbc85;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5f8,0,(char *)0x0,(ulong)local_9f8);
  }
  else {
LAB_001dbc85:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9f8,(ulong)local_5f8);
  }
  local_a58 = &local_a48;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_a48 = *puVar13;
    uStack_a40 = puVar10[3];
  }
  else {
    local_a48 = *puVar13;
    local_a58 = (ulong *)*puVar10;
  }
  local_a50 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_a58);
  local_9d8 = &local_9c8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_9c8 = *puVar13;
    lStack_9c0 = plVar8[3];
  }
  else {
    local_9c8 = *puVar13;
    local_9d8 = (ulong *)*plVar8;
  }
  local_9d0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_618 = local_608;
  std::__cxx11::string::_M_construct((ulong)&local_618,'\t');
  uVar22 = 0xf;
  if (local_9d8 != &local_9c8) {
    uVar22 = local_9c8;
  }
  if (uVar22 < (ulong)(local_610 + local_9d0)) {
    uVar22 = 0xf;
    if (local_618 != local_608) {
      uVar22 = local_608[0];
    }
    if (uVar22 < (ulong)(local_610 + local_9d0)) goto LAB_001dbdea;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_618,0,(char *)0x0,(ulong)local_9d8);
  }
  else {
LAB_001dbdea:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_9d8,(ulong)local_618);
  }
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_9a8 = *puVar13;
    uStack_9a0 = puVar10[3];
    local_9b8 = &local_9a8;
  }
  else {
    local_9a8 = *puVar13;
    local_9b8 = (ulong *)*puVar10;
  }
  local_9b0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_9b8);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_8e8 = *puVar13;
    lStack_8e0 = plVar8[3];
    local_8f8 = &local_8e8;
  }
  else {
    local_8e8 = *puVar13;
    local_8f8 = (ulong *)*plVar8;
  }
  local_8f0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_638 = local_628;
  std::__cxx11::string::_M_construct((ulong)&local_638,'\t');
  uVar22 = 0xf;
  if (local_8f8 != &local_8e8) {
    uVar22 = local_8e8;
  }
  if (uVar22 < (ulong)(local_630 + local_8f0)) {
    uVar22 = 0xf;
    if (local_638 != local_628) {
      uVar22 = local_628[0];
    }
    if (uVar22 < (ulong)(local_630 + local_8f0)) goto LAB_001dbf49;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_638,0,(char *)0x0,(ulong)local_8f8);
  }
  else {
LAB_001dbf49:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_8f8,(ulong)local_638);
  }
  local_998 = &local_988;
  plVar8 = puVar10 + 2;
  if ((long *)*puVar10 == plVar8) {
    local_988 = *plVar8;
    lStack_980 = puVar10[3];
  }
  else {
    local_988 = *plVar8;
    local_998 = (long *)*puVar10;
  }
  local_990 = puVar10[1];
  *puVar10 = plVar8;
  puVar10[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_998);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_b48 = *puVar13;
    lStack_b40 = plVar8[3];
    local_b58 = &local_b48;
  }
  else {
    local_b48 = *puVar13;
    local_b58 = (ulong *)*plVar8;
  }
  local_b50 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_658 = local_648;
  std::__cxx11::string::_M_construct((ulong)&local_658,'\x06');
  uVar22 = 0xf;
  if (local_b58 != &local_b48) {
    uVar22 = local_b48;
  }
  if (uVar22 < (ulong)(local_650 + local_b50)) {
    uVar22 = 0xf;
    if (local_658 != local_648) {
      uVar22 = local_648[0];
    }
    if (uVar22 < (ulong)(local_650 + local_b50)) goto LAB_001dc0a7;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_658,0,(char *)0x0,(ulong)local_b58);
  }
  else {
LAB_001dc0a7:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b58,(ulong)local_658);
  }
  local_b38 = &local_b28;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_b28 = *puVar13;
    uStack_b20 = puVar10[3];
  }
  else {
    local_b28 = *puVar13;
    local_b38 = (ulong *)*puVar10;
  }
  local_b30 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b38);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_b18.field_2._M_allocated_capacity = *puVar13;
    local_b18.field_2._8_8_ = plVar8[3];
    local_b18._M_dataplus._M_p = (pointer)&local_b18.field_2;
  }
  else {
    local_b18.field_2._M_allocated_capacity = *puVar13;
    local_b18._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_b18._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_678 = local_668;
  std::__cxx11::string::_M_construct((ulong)&local_678,'\x06');
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    uVar19 = local_b18.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_670 + local_b18._M_string_length) {
    uVar22 = 0xf;
    if (local_678 != local_668) {
      uVar22 = local_668[0];
    }
    if (uVar22 < local_670 + local_b18._M_string_length) goto LAB_001dc205;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_678,0,(char *)0x0,(ulong)local_b18._M_dataplus._M_p);
  }
  else {
LAB_001dc205:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b18,(ulong)local_678);
  }
  local_ad8 = &local_ac8;
  puVar1 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar1) {
    local_ac8 = *puVar1;
    uStack_ac0 = puVar10[3];
  }
  else {
    local_ac8 = *puVar1;
    local_ad8 = (undefined8 *)*puVar10;
  }
  local_ad0 = puVar10[1];
  *puVar10 = puVar1;
  puVar10[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_ad8);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_bc8 = *puVar13;
    lStack_bc0 = plVar8[3];
    local_bd8 = &local_bc8;
  }
  else {
    local_bc8 = *puVar13;
    local_bd8 = (ulong *)*plVar8;
  }
  local_bd0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_bd8);
  local_b78 = &local_b68;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_b68 = *puVar13;
    lStack_b60 = plVar8[3];
  }
  else {
    local_b68 = *puVar13;
    local_b78 = (ulong *)*plVar8;
  }
  local_b70 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_698 = local_688;
  std::__cxx11::string::_M_construct((ulong)&local_698,'\x06');
  uVar22 = 0xf;
  if (local_b78 != &local_b68) {
    uVar22 = local_b68;
  }
  if (uVar22 < (ulong)(local_690 + local_b70)) {
    uVar22 = 0xf;
    if (local_698 != local_688) {
      uVar22 = local_688[0];
    }
    if (uVar22 < (ulong)(local_690 + local_b70)) goto LAB_001dc3d0;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_698,0,(char *)0x0,(ulong)local_b78);
  }
  else {
LAB_001dc3d0:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b78,(ulong)local_698);
  }
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_ba8 = *puVar13;
    uStack_ba0 = puVar10[3];
    local_bb8 = &local_ba8;
  }
  else {
    local_ba8 = *puVar13;
    local_bb8 = (ulong *)*puVar10;
  }
  local_bb0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_bb8);
  local_af8 = &local_ae8;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_ae8 = *puVar13;
    lStack_ae0 = plVar8[3];
  }
  else {
    local_ae8 = *puVar13;
    local_af8 = (ulong *)*plVar8;
  }
  local_af0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_6b8 = local_6a8;
  std::__cxx11::string::_M_construct((ulong)&local_6b8,'\x06');
  uVar22 = 0xf;
  if (local_af8 != &local_ae8) {
    uVar22 = local_ae8;
  }
  if (uVar22 < (ulong)(local_6b0 + local_af0)) {
    uVar22 = 0xf;
    if (local_6b8 != local_6a8) {
      uVar22 = local_6a8[0];
    }
    if (uVar22 < (ulong)(local_6b0 + local_af0)) goto LAB_001dc536;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_6b8,0,(char *)0x0,(ulong)local_af8);
  }
  else {
LAB_001dc536:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_af8,(ulong)local_6b8);
  }
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_b88 = *puVar13;
    lStack_b80 = puVar10[3];
    local_b98 = &local_b88;
  }
  else {
    local_b88 = *puVar13;
    local_b98 = (ulong *)*puVar10;
  }
  local_b90 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b98);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_be8 = *puVar13;
    lStack_be0 = plVar8[3];
    local_bf8 = &local_be8;
  }
  else {
    local_be8 = *puVar13;
    local_bf8 = (ulong *)*plVar8;
  }
  local_bf0 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,'\x06');
  uVar22 = 0xf;
  if (local_bf8 != &local_be8) {
    uVar22 = local_be8;
  }
  if (uVar22 < (ulong)(local_e8 + local_bf0)) {
    uVar22 = 0xf;
    if (local_f0 != local_e0) {
      uVar22 = local_e0[0];
    }
    if (uVar22 < (ulong)(local_e8 + local_bf0)) goto LAB_001dc685;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_bf8);
  }
  else {
LAB_001dc685:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_bf8,(ulong)local_f0);
  }
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_c28 = *puVar13;
    lStack_c20 = puVar10[3];
    local_c38 = &local_c28;
  }
  else {
    local_c28 = *puVar13;
    local_c38 = (ulong *)*puVar10;
  }
  local_c30 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c38);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_c48 = *puVar13;
    lStack_c40 = plVar8[3];
    local_c58 = &local_c48;
  }
  else {
    local_c48 = *puVar13;
    local_c58 = (ulong *)*plVar8;
  }
  local_c50 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,'\x06');
  uVar22 = 0xf;
  if (local_c58 != &local_c48) {
    uVar22 = local_c48;
  }
  if (uVar22 < (ulong)(local_108 + local_c50)) {
    uVar22 = 0xf;
    if (local_110 != local_100) {
      uVar22 = local_100[0];
    }
    if (uVar22 < (ulong)(local_108 + local_c50)) goto LAB_001dc7ce;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_c58);
  }
  else {
LAB_001dc7ce:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c58,(ulong)local_110);
  }
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_ca8 = *puVar13;
    uStack_ca0 = puVar10[3];
    local_cb8 = &local_ca8;
  }
  else {
    local_ca8 = *puVar13;
    local_cb8 = (ulong *)*puVar10;
  }
  local_cb0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_cb8);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_c08 = *puVar13;
    lStack_c00 = plVar8[3];
    local_c18 = &local_c08;
  }
  else {
    local_c08 = *puVar13;
    local_c18 = (ulong *)*plVar8;
  }
  local_c10 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,'\x06');
  uVar22 = 0xf;
  if (local_c18 != &local_c08) {
    uVar22 = local_c08;
  }
  if (uVar22 < (ulong)(local_128 + local_c10)) {
    uVar22 = 0xf;
    if (local_130 != local_120) {
      uVar22 = local_120[0];
    }
    if (uVar22 < (ulong)(local_128 + local_c10)) goto LAB_001dc91c;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_c18);
  }
  else {
LAB_001dc91c:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c18,(ulong)local_130);
  }
  local_c78 = &local_c68;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_c68 = *puVar13;
    lStack_c60 = puVar10[3];
  }
  else {
    local_c68 = *puVar13;
    local_c78 = (ulong *)*puVar10;
  }
  local_c70 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_c78);
  local_d18._M_dataplus._M_p = (pointer)&local_d18.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_d18.field_2._M_allocated_capacity = *puVar13;
    local_d18.field_2._8_8_ = plVar8[3];
  }
  else {
    local_d18.field_2._M_allocated_capacity = *puVar13;
    local_d18._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d18._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_150 = local_140;
  std::__cxx11::string::_M_construct((ulong)&local_150,'\t');
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    uVar19 = local_d18.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_148 + local_d18._M_string_length) {
    uVar22 = 0xf;
    if (local_150 != local_140) {
      uVar22 = local_140[0];
    }
    if (uVar22 < local_148 + local_d18._M_string_length) goto LAB_001dca79;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_150,0,(char *)0x0,(ulong)local_d18._M_dataplus._M_p);
  }
  else {
LAB_001dca79:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d18,(ulong)local_150);
  }
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_d68 = *puVar13;
    uStack_d60 = puVar10[3];
    local_d78 = &local_d68;
  }
  else {
    local_d68 = *puVar13;
    local_d78 = (ulong *)*puVar10;
  }
  local_d70 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d78);
  local_d38._M_dataplus._M_p = (pointer)&local_d38.field_2;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_d38.field_2._M_allocated_capacity = *puVar13;
    local_d38.field_2._8_8_ = plVar8[3];
  }
  else {
    local_d38.field_2._M_allocated_capacity = *puVar13;
    local_d38._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_d38._M_string_length = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_170 = local_160;
  std::__cxx11::string::_M_construct((ulong)&local_170,'\x06');
  uVar19 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    uVar19 = local_d38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < local_168 + local_d38._M_string_length) {
    uVar22 = 0xf;
    if (local_170 != local_160) {
      uVar22 = local_160[0];
    }
    if (uVar22 < local_168 + local_d38._M_string_length) goto LAB_001dcbd0;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_170,0,(char *)0x0,(ulong)local_d38._M_dataplus._M_p);
  }
  else {
LAB_001dcbd0:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d38,(ulong)local_170);
  }
  local_db8 = &local_da8;
  puVar13 = puVar10 + 2;
  if ((ulong *)*puVar10 == puVar13) {
    local_da8 = *puVar13;
    lStack_da0 = puVar10[3];
  }
  else {
    local_da8 = *puVar13;
    local_db8 = (ulong *)*puVar10;
  }
  local_db0 = puVar10[1];
  *puVar10 = puVar13;
  puVar10[1] = 0;
  *(undefined1 *)puVar13 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_db8);
  local_d98 = &local_d88;
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_d88 = *puVar13;
    lStack_d80 = plVar8[3];
  }
  else {
    local_d88 = *puVar13;
    local_d98 = (ulong *)*plVar8;
  }
  local_d90 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_190 = local_180;
  std::__cxx11::string::_M_construct((ulong)&local_190,'\x03');
  uVar22 = 0xf;
  if (local_d98 != &local_d88) {
    uVar22 = local_d88;
  }
  if (uVar22 < (ulong)(local_188 + local_d90)) {
    uVar22 = 0xf;
    if (local_190 != local_180) {
      uVar22 = local_180[0];
    }
    if ((ulong)(local_188 + local_d90) <= uVar22) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_d98);
      goto LAB_001dcd4d;
    }
  }
  puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d98,(ulong)local_190);
LAB_001dcd4d:
  local_e38._M_dataplus._M_p = (pointer)&local_e38.field_2;
  psVar15 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_e38.field_2._M_allocated_capacity = *psVar15;
    local_e38.field_2._8_8_ = puVar10[3];
  }
  else {
    local_e38.field_2._M_allocated_capacity = *psVar15;
    local_e38._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_e38._M_string_length = puVar10[1];
  *puVar10 = psVar15;
  puVar10[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_e38);
  local_dd8 = &local_dc8;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_dc8 = *plVar12;
    lStack_dc0 = plVar8[3];
  }
  else {
    local_dc8 = *plVar12;
    local_dd8 = (long *)*plVar8;
  }
  local_dd0 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  if (local_d98 != &local_d88) {
    operator_delete(local_d98);
  }
  if (local_db8 != &local_da8) {
    operator_delete(local_db8);
  }
  if (local_170 != local_160) {
    operator_delete(local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d38._M_dataplus._M_p != &local_d38.field_2) {
    operator_delete(local_d38._M_dataplus._M_p);
  }
  if (local_d78 != &local_d68) {
    operator_delete(local_d78);
  }
  if (local_150 != local_140) {
    operator_delete(local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d18._M_dataplus._M_p != &local_d18.field_2) {
    operator_delete(local_d18._M_dataplus._M_p);
  }
  if (local_c78 != &local_c68) {
    operator_delete(local_c78);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  if (local_c18 != &local_c08) {
    operator_delete(local_c18);
  }
  if (local_cb8 != &local_ca8) {
    operator_delete(local_cb8);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  psVar5 = local_198;
  if (local_c58 != &local_c48) {
    operator_delete(local_c58);
  }
  if (local_c38 != &local_c28) {
    operator_delete(local_c38);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_bf8 != &local_be8) {
    operator_delete(local_bf8);
  }
  if (local_b98 != &local_b88) {
    operator_delete(local_b98);
  }
  if (local_6b8 != local_6a8) {
    operator_delete(local_6b8);
  }
  if (local_af8 != &local_ae8) {
    operator_delete(local_af8);
  }
  if (local_bb8 != &local_ba8) {
    operator_delete(local_bb8);
  }
  if (local_698 != local_688) {
    operator_delete(local_698);
  }
  if (local_b78 != &local_b68) {
    operator_delete(local_b78);
  }
  if (local_bd8 != &local_bc8) {
    operator_delete(local_bd8);
  }
  if (local_ad8 != &local_ac8) {
    operator_delete(local_ad8);
  }
  if (local_678 != local_668) {
    operator_delete(local_678);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b18._M_dataplus._M_p != &local_b18.field_2) {
    operator_delete(local_b18._M_dataplus._M_p);
  }
  if (local_b38 != &local_b28) {
    operator_delete(local_b38);
  }
  if (local_658 != local_648) {
    operator_delete(local_658);
  }
  if (local_b58 != &local_b48) {
    operator_delete(local_b58);
  }
  if (local_998 != &local_988) {
    operator_delete(local_998);
  }
  if (local_638 != local_628) {
    operator_delete(local_638);
  }
  if (local_8f8 != &local_8e8) {
    operator_delete(local_8f8);
  }
  if (local_9b8 != &local_9a8) {
    operator_delete(local_9b8);
  }
  if (local_618 != local_608) {
    operator_delete(local_618);
  }
  if (local_9d8 != &local_9c8) {
    operator_delete(local_9d8);
  }
  if (local_a58 != &local_a48) {
    operator_delete(local_a58);
  }
  if (local_5f8 != local_5e8) {
    operator_delete(local_5f8);
  }
  if (local_9f8 != &local_9e8) {
    operator_delete(local_9f8);
  }
  if (local_a78 != &local_a68) {
    operator_delete(local_a78);
  }
  if (local_5d8 != local_5c8) {
    operator_delete(local_5d8);
  }
  if (local_a18 != &local_a08) {
    operator_delete(local_a18);
  }
  if (local_918 != &local_908) {
    operator_delete(local_918);
  }
  if (local_938 != &local_928) {
    operator_delete(local_938);
  }
  if (local_958 != &local_948) {
    operator_delete(local_958);
  }
  if (local_978 != &local_968) {
    operator_delete(local_978);
  }
  if (local_a98 != &local_a88) {
    operator_delete(local_a98);
  }
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8);
  }
  if (local_a38 != &local_a28) {
    operator_delete(local_a38);
  }
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8);
  }
  if (local_598 != local_588) {
    operator_delete(local_598);
  }
  if (local_6d8 != &local_6c8) {
    operator_delete(local_6d8);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_578 != local_568) {
    operator_delete(local_578);
  }
  if (local_6f8 != &local_6e8) {
    operator_delete(local_6f8);
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_558 != local_548) {
    operator_delete(local_558);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_538 != local_528) {
    operator_delete(local_538);
  }
  if (local_738 != &local_728) {
    operator_delete(local_738);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_518 != local_508) {
    operator_delete(local_518);
  }
  if (local_758 != &local_748) {
    operator_delete(local_758);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8);
  }
  if (local_778 != &local_768) {
    operator_delete(local_778);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278);
  }
  if (local_4d8 != local_4c8) {
    operator_delete(local_4d8);
  }
  if (local_798 != &local_788) {
    operator_delete(local_798);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298);
  }
  if (local_4b8 != local_4a8) {
    operator_delete(local_4b8);
  }
  if (local_7b8 != &local_7a8) {
    operator_delete(local_7b8);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_498 != local_488) {
    operator_delete(local_498);
  }
  if (local_7d8 != &local_7c8) {
    operator_delete(local_7d8);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8);
  }
  if (local_478 != local_468) {
    operator_delete(local_478);
  }
  if (local_7f8 != &local_7e8) {
    operator_delete(local_7f8);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8);
  }
  if (local_458 != local_448) {
    operator_delete(local_458);
  }
  if (local_818 != &local_808) {
    operator_delete(local_818);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318);
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (local_838 != &local_828) {
    operator_delete(local_838);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338);
  }
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  if (local_858 != &local_848) {
    operator_delete(local_858);
  }
  if (local_358 != &local_348) {
    operator_delete(local_358);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_878 != &local_868) {
    operator_delete(local_878);
  }
  if (local_378 != &local_368) {
    operator_delete(local_378);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  if (local_898 != &local_888) {
    operator_delete(local_898);
  }
  if (local_398 != &local_388) {
    operator_delete(local_398);
  }
  if (local_3b8 != local_3a8) {
    operator_delete(local_3b8);
  }
  if (local_8b8 != &local_8a8) {
    operator_delete(local_8b8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  std::operator+(&local_e38,&local_cf8,&local_cd8);
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_e38,(ulong)local_dd8);
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar15 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar15) {
    lVar21 = plVar8[3];
    (psVar5->field_2)._M_allocated_capacity = *psVar15;
    *(long *)((long)&psVar5->field_2 + 8) = lVar21;
  }
  else {
    (psVar5->_M_dataplus)._M_p = (pointer)*plVar8;
    (psVar5->field_2)._M_allocated_capacity = *psVar15;
  }
  psVar5->_M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e38._M_dataplus._M_p != &local_e38.field_2) {
    operator_delete(local_e38._M_dataplus._M_p);
  }
  if (local_dd8 != &local_dc8) {
    operator_delete(local_dd8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
    operator_delete(local_df8._M_dataplus._M_p);
  }
  if (local_e18 != &local_e08) {
    operator_delete(local_e18);
  }
  if (local_c98 != &local_c88) {
    operator_delete(local_c98);
  }
  if (local_d58 != &local_d48) {
    operator_delete(local_d58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd8._M_dataplus._M_p != &local_cd8.field_2) {
    operator_delete(local_cd8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf8._M_dataplus._M_p != &local_cf8.field_2) {
    operator_delete(local_cf8._M_dataplus._M_p);
  }
  if (local_8d8 != &local_8c8) {
    operator_delete(local_8d8);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  return psVar5;
}

Assistant:

std::string KMeans::genModelEvaluationFunction()
{
    std::string attributeString = "",
        attrConstruct = offset(4)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
    
    for (size_t var = 0; var < numberOfOriginalVariables; ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(5)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(2)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(5)+"\'|\');\n";

    std::string testTuple = offset(1)+"struct Test_tuple\n"+offset(1)+"{\n"+
        attributeString+offset(2)+"Test_tuple(const std::string& tuple)\n"+
        offset(2)+"{\n"+attrConstruct+offset(2)+"}\n"+offset(1)+"};\n\n";

    std::string loadFunction = offset(1)+"void loadTestDataset("+
        "std::vector<Test_tuple>& TestDataset)\n"+offset(1)+"{\n"+
        offset(2)+"std::ifstream input;\n"+offset(2)+"std::string line;\n"+
        offset(2)+"input.open(PATH_TO_DATA + \"/joinresult.tbl\");\n"+
        offset(2)+"if (!input)\n"+offset(2)+"{\n"+
        offset(3)+"std::cerr << \"joinresult.tbl does is not exist.\\n\";\n"+
        offset(3)+"exit(1);\n"+offset(2)+"}\n"+
        offset(2)+"while(getline(input, line))\n"+
        offset(3)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(2)+"input.close();\n"+offset(1)+"}\n\n";

    size_t categVarIdx = 0;
    std::string distance = "", valueToMeanMap = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!_features[var])
            continue;

        Attribute* att = _td->getAttribute(var);
        std::string& varName = att->_name;
        
        if (_isCategoricalFeature[var])
        {
            const std::string& viewName = "V"+std::to_string(
                varToQuery[var]->_aggregates[0]->_incoming[0].first);
            
            distance += "-2*means[cluster].cluster_"+varName+"["+
                varName+"_clusterIndex[tuple."+varName+"]]";

            valueToMeanMap += "\n"+offset(2)+"std::unordered_map<"+
                typeToStr(att->_type)+", size_t> "+
                varName+"_clusterIndex("+viewName+".size());\n"+
                offset(2)+"for (size_t l=0; l<"+viewName+".size(); ++l)\n"+
                offset(3)+varName+"_clusterIndex["+viewName+"[l]."+varName+"] = l;\n";

            ++categVarIdx;
        }
        else
            distance += "+((tuple."+att->_name+"-means[cluster].cluster_"+att->_name+")"+
                "*(tuple."+att->_name+"-means[cluster].cluster_"+att->_name+"))";
    }
    
    std::string numCategVar = std::to_string(_isCategoricalFeature.count()/2); 

    std::string precompMeanSum = "";
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (!clusterVariables[var] || !_isCategoricalFeature[var])
            continue;

        size_t origVar = clusterToVariableMap[var];
        const std::string& origView = "V"+std::to_string(
            varToQuery[origVar]->_aggregates[0]->_incoming[0].first);

        const std::string& attName = _td->getAttribute(var)->_name;

        // precompMeanSum += offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        //     Offset(2)+"{\N"+offset(3)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
        //     offset(4)+"sum_mean_squared[idx] += std::pow(means[cluster]."
        //     +attName+"[i],2);\n"+offset(3)+"++idx;\n"+offset(2)+"}\n\n";
        
        precompMeanSum += offset(3)+"for (size_t i = 0; i < "+origView+".size(); ++i)\n"+
            offset(4)+"sum_mean_squared[cluster] += std::pow(mean_tuple."
            +attName+"[i],2);\n\n";
    }
    
    std::string evalFunction = offset(1)+"void evaluateModel(Cluster_mean* means)\n"+
        offset(1)+"{\n"+
        offset(2)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(2)+"loadTestDataset(TestDataset);\n"+
        offset(2)+"size_t idx = 0;\n"+valueToMeanMap+"\n"+
        offset(2)+"double sum_mean_squared[k] = {};\n"+
        offset(2)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+
        offset(2)+"{\n"+offset(3)+"Cluster_mean& mean_tuple = means[cluster];\n"+
        precompMeanSum+offset(2)+"}\n"+
        offset(2)+"double distance, error = 0.0, "+
        "min_distance;\n"+
        offset(2)+"std::vector<size_t> assignments(TestDataset.size());\n"+
        // offset(2)+"#pragma omp parallel for num_threads(32) private(min_distance,distance) reduction(+:error)\n"+
        offset(2)+"for (size_t tup = 0; tup < TestDataset.size(); ++tup){\n"+
        offset(3)+"const Test_tuple &tuple = TestDataset[tup];\n"+
        // offset(2)+"for (Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(3)+"min_distance = std::numeric_limits<double>::max();\n"+
        offset(3)+"for (size_t cluster = 0; cluster < k; ++cluster)\n"+offset(3)+"{\n"+
        offset(4)+"distance = "+numCategVar+"+sum_mean_squared[cluster]"+distance+";\n"+
        offset(4)+"if(distance < min_distance) assignments[tup] = cluster;\n"+
        offset(4)+"min_distance = std::min(distance, min_distance);\n"+
        offset(3)+"}\n"+offset(3)+"error += min_distance;\n"+
        offset(2)+"}\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | "+
        "std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\t\" << error;\n"+
        offset(2)+"ofs.close();\n\n"+
        offset(2)+
        "std::cout << \"Within Cluster l2-distance: \" << error << std::endl;\n"+
        offset(2)+"ofs.open(\"assignments.csv\");\n"+
        offset(2)+"for (const size_t& a : assignments)\n"+
        offset(3)+"ofs << a << \"\\n\";\n"+
        offset(2)+"ofs.close();\n"+
        offset(1)+"}\n";

    return testTuple + loadFunction + evalFunction;
}